

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Primitive PVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  float fVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [12];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  byte bVar64;
  ulong uVar65;
  byte bVar66;
  byte bVar67;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  ulong uVar68;
  uint uVar69;
  int iVar70;
  byte bVar71;
  byte bVar72;
  long lVar73;
  undefined1 uVar74;
  bool bVar75;
  undefined1 uVar76;
  bool bVar77;
  ulong uVar78;
  uint uVar129;
  uint uVar130;
  uint uVar131;
  uint uVar132;
  uint uVar133;
  uint uVar134;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  uint uVar135;
  float pp;
  float fVar136;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar137;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar155;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  float fVar197;
  undefined4 uVar198;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [64];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  float fVar217;
  float fVar224;
  float fVar225;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar226;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar227;
  float fVar228;
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [28];
  float fVar233;
  undefined1 auVar232 [64];
  undefined1 auVar234 [32];
  float fVar237;
  undefined1 auVar235 [16];
  float fVar238;
  undefined1 auVar236 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [32];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_920 [16];
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  uint local_8b4;
  uint local_8b0;
  undefined4 local_8ac;
  float local_8a8;
  float local_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  Primitive *local_6c8;
  ulong local_6c0;
  ulong local_6b8;
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  RTCHitN local_440 [16];
  undefined1 auStack_430 [16];
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  float local_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [16];
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [16];
  uint local_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte local_180 [32];
  uint auStack_160 [8];
  float local_140 [2];
  int local_138 [66];
  
  PVar3 = prim[1];
  uVar78 = (ulong)(byte)PVar3;
  fVar217 = *(float *)(prim + uVar78 * 0x19 + 0x12);
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar14 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar212 = vsubps_avx(auVar81,*(undefined1 (*) [16])(prim + uVar78 * 0x19 + 6));
  fVar197 = fVar217 * auVar212._0_4_;
  fVar136 = fVar217 * auVar14._0_4_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar78 * 4 + 6);
  auVar91 = vpmovsxbd_avx2(auVar81);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar78 * 5 + 6);
  auVar90 = vpmovsxbd_avx2(auVar82);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar78 * 6 + 6);
  auVar92 = vpmovsxbd_avx2(auVar79);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar78 * 0xb + 6);
  auVar93 = vpmovsxbd_avx2(auVar83);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  auVar94 = vpmovsxbd_avx2(auVar1);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + (uint)(byte)PVar3 * 0xc + uVar78 + 6);
  auVar95 = vpmovsxbd_avx2(auVar2);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar65 = (ulong)(uint)((int)(uVar78 * 9) * 2);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar65 + 6);
  auVar96 = vpmovsxbd_avx2(auVar84);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar65 + uVar78 + 6);
  auVar99 = vpmovsxbd_avx2(auVar80);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar97 = vcvtdq2ps_avx(auVar99);
  uVar68 = (ulong)(uint)((int)(uVar78 * 5) << 2);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar88 = vpmovsxbd_avx2(auVar85);
  auVar98 = vcvtdq2ps_avx(auVar88);
  auVar106._4_4_ = fVar136;
  auVar106._0_4_ = fVar136;
  auVar106._8_4_ = fVar136;
  auVar106._12_4_ = fVar136;
  auVar106._16_4_ = fVar136;
  auVar106._20_4_ = fVar136;
  auVar106._24_4_ = fVar136;
  auVar106._28_4_ = fVar136;
  auVar108._8_4_ = 1;
  auVar108._0_8_ = 0x100000001;
  auVar108._12_4_ = 1;
  auVar108._16_4_ = 1;
  auVar108._20_4_ = 1;
  auVar108._24_4_ = 1;
  auVar108._28_4_ = 1;
  auVar100 = ZEXT1632(CONCAT412(fVar217 * auVar14._12_4_,
                                CONCAT48(fVar217 * auVar14._8_4_,
                                         CONCAT44(fVar217 * auVar14._4_4_,fVar136))));
  auVar89 = vpermps_avx2(auVar108,auVar100);
  auVar86 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar87 = vpermps_avx512vl(auVar86,auVar100);
  fVar136 = auVar87._0_4_;
  fVar224 = auVar87._4_4_;
  auVar100._4_4_ = fVar224 * auVar92._4_4_;
  auVar100._0_4_ = fVar136 * auVar92._0_4_;
  fVar225 = auVar87._8_4_;
  auVar100._8_4_ = fVar225 * auVar92._8_4_;
  fVar226 = auVar87._12_4_;
  auVar100._12_4_ = fVar226 * auVar92._12_4_;
  fVar233 = auVar87._16_4_;
  auVar100._16_4_ = fVar233 * auVar92._16_4_;
  fVar137 = auVar87._20_4_;
  auVar100._20_4_ = fVar137 * auVar92._20_4_;
  fVar227 = auVar87._24_4_;
  auVar100._24_4_ = fVar227 * auVar92._24_4_;
  auVar100._28_4_ = auVar99._28_4_;
  auVar99._4_4_ = auVar95._4_4_ * fVar224;
  auVar99._0_4_ = auVar95._0_4_ * fVar136;
  auVar99._8_4_ = auVar95._8_4_ * fVar225;
  auVar99._12_4_ = auVar95._12_4_ * fVar226;
  auVar99._16_4_ = auVar95._16_4_ * fVar233;
  auVar99._20_4_ = auVar95._20_4_ * fVar137;
  auVar99._24_4_ = auVar95._24_4_ * fVar227;
  auVar99._28_4_ = auVar88._28_4_;
  auVar88._4_4_ = auVar98._4_4_ * fVar224;
  auVar88._0_4_ = auVar98._0_4_ * fVar136;
  auVar88._8_4_ = auVar98._8_4_ * fVar225;
  auVar88._12_4_ = auVar98._12_4_ * fVar226;
  auVar88._16_4_ = auVar98._16_4_ * fVar233;
  auVar88._20_4_ = auVar98._20_4_ * fVar137;
  auVar88._24_4_ = auVar98._24_4_ * fVar227;
  auVar88._28_4_ = auVar87._28_4_;
  auVar81 = vfmadd231ps_fma(auVar100,auVar89,auVar90);
  auVar82 = vfmadd231ps_fma(auVar99,auVar89,auVar94);
  auVar79 = vfmadd231ps_fma(auVar88,auVar97,auVar89);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar106,auVar91);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar106,auVar93);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar96,auVar106);
  auVar107._4_4_ = fVar197;
  auVar107._0_4_ = fVar197;
  auVar107._8_4_ = fVar197;
  auVar107._12_4_ = fVar197;
  auVar107._16_4_ = fVar197;
  auVar107._20_4_ = fVar197;
  auVar107._24_4_ = fVar197;
  auVar107._28_4_ = fVar197;
  auVar88 = ZEXT1632(CONCAT412(fVar217 * auVar212._12_4_,
                               CONCAT48(fVar217 * auVar212._8_4_,
                                        CONCAT44(fVar217 * auVar212._4_4_,fVar197))));
  auVar99 = vpermps_avx2(auVar108,auVar88);
  auVar88 = vpermps_avx512vl(auVar86,auVar88);
  auVar89 = vmulps_avx512vl(auVar88,auVar92);
  auVar102._0_4_ = auVar88._0_4_ * auVar95._0_4_;
  auVar102._4_4_ = auVar88._4_4_ * auVar95._4_4_;
  auVar102._8_4_ = auVar88._8_4_ * auVar95._8_4_;
  auVar102._12_4_ = auVar88._12_4_ * auVar95._12_4_;
  auVar102._16_4_ = auVar88._16_4_ * auVar95._16_4_;
  auVar102._20_4_ = auVar88._20_4_ * auVar95._20_4_;
  auVar102._24_4_ = auVar88._24_4_ * auVar95._24_4_;
  auVar102._28_4_ = 0;
  auVar95._4_4_ = auVar88._4_4_ * auVar98._4_4_;
  auVar95._0_4_ = auVar88._0_4_ * auVar98._0_4_;
  auVar95._8_4_ = auVar88._8_4_ * auVar98._8_4_;
  auVar95._12_4_ = auVar88._12_4_ * auVar98._12_4_;
  auVar95._16_4_ = auVar88._16_4_ * auVar98._16_4_;
  auVar95._20_4_ = auVar88._20_4_ * auVar98._20_4_;
  auVar95._24_4_ = auVar88._24_4_ * auVar98._24_4_;
  auVar95._28_4_ = auVar92._28_4_;
  auVar90 = vfmadd231ps_avx512vl(auVar89,auVar99,auVar90);
  auVar83 = vfmadd231ps_fma(auVar102,auVar99,auVar94);
  auVar1 = vfmadd231ps_fma(auVar95,auVar99,auVar97);
  auVar90 = vfmadd231ps_avx512vl(auVar90,auVar107,auVar91);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar107,auVar93);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar107,auVar96);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar253 = ZEXT3264(auVar91);
  vandps_avx512vl(ZEXT1632(auVar81),auVar91);
  auVar104._8_4_ = 0x219392ef;
  auVar104._0_8_ = 0x219392ef219392ef;
  auVar104._12_4_ = 0x219392ef;
  auVar104._16_4_ = 0x219392ef;
  auVar104._20_4_ = 0x219392ef;
  auVar104._24_4_ = 0x219392ef;
  auVar104._28_4_ = 0x219392ef;
  uVar65 = vcmpps_avx512vl(auVar91,auVar104,1);
  bVar77 = (bool)((byte)uVar65 & 1);
  auVar89._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar81._0_4_;
  bVar77 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar81._4_4_;
  bVar77 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar81._8_4_;
  bVar77 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar81._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar65 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar82),auVar91);
  uVar65 = vcmpps_avx512vl(auVar89,auVar104,1);
  bVar77 = (bool)((byte)uVar65 & 1);
  auVar86._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar82._0_4_;
  bVar77 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar82._4_4_;
  bVar77 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar82._8_4_;
  bVar77 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar82._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar65 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar79),auVar91);
  uVar65 = vcmpps_avx512vl(auVar86,auVar104,1);
  bVar77 = (bool)((byte)uVar65 & 1);
  auVar91._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar79._0_4_;
  bVar77 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar79._4_4_;
  bVar77 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar79._8_4_;
  bVar77 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar79._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar65 >> 7) * 0x219392ef;
  auVar92 = vrcp14ps_avx512vl(auVar89);
  auVar105._8_4_ = 0x3f800000;
  auVar105._0_8_ = &DAT_3f8000003f800000;
  auVar105._12_4_ = 0x3f800000;
  auVar105._16_4_ = 0x3f800000;
  auVar105._20_4_ = 0x3f800000;
  auVar105._24_4_ = 0x3f800000;
  auVar105._28_4_ = 0x3f800000;
  auVar81 = vfnmadd213ps_fma(auVar89,auVar92,auVar105);
  auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar86);
  auVar82 = vfnmadd213ps_fma(auVar86,auVar92,auVar105);
  auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar91);
  auVar79 = vfnmadd213ps_fma(auVar91,auVar92,auVar105);
  auVar79 = vfmadd132ps_fma(ZEXT1632(auVar79),auVar92,auVar92);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 7 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar92 = vsubps_avx512vl(auVar91,auVar90);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 9 + 6));
  auVar96._4_4_ = auVar81._4_4_ * auVar92._4_4_;
  auVar96._0_4_ = auVar81._0_4_ * auVar92._0_4_;
  auVar96._8_4_ = auVar81._8_4_ * auVar92._8_4_;
  auVar96._12_4_ = auVar81._12_4_ * auVar92._12_4_;
  auVar96._16_4_ = auVar92._16_4_ * 0.0;
  auVar96._20_4_ = auVar92._20_4_ * 0.0;
  auVar96._24_4_ = auVar92._24_4_ * 0.0;
  auVar96._28_4_ = auVar92._28_4_;
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx512vl(auVar91,auVar90);
  auVar103._0_4_ = auVar81._0_4_ * auVar91._0_4_;
  auVar103._4_4_ = auVar81._4_4_ * auVar91._4_4_;
  auVar103._8_4_ = auVar81._8_4_ * auVar91._8_4_;
  auVar103._12_4_ = auVar81._12_4_ * auVar91._12_4_;
  auVar103._16_4_ = auVar91._16_4_ * 0.0;
  auVar103._20_4_ = auVar91._20_4_ * 0.0;
  auVar103._24_4_ = auVar91._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar3 * 0x10 + 6));
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar3 * 0x10 + uVar78 * -2 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar83));
  auVar97._4_4_ = auVar82._4_4_ * auVar91._4_4_;
  auVar97._0_4_ = auVar82._0_4_ * auVar91._0_4_;
  auVar97._8_4_ = auVar82._8_4_ * auVar91._8_4_;
  auVar97._12_4_ = auVar82._12_4_ * auVar91._12_4_;
  auVar97._16_4_ = auVar91._16_4_ * 0.0;
  auVar97._20_4_ = auVar91._20_4_ * 0.0;
  auVar97._24_4_ = auVar91._24_4_ * 0.0;
  auVar97._28_4_ = auVar91._28_4_;
  auVar91 = vcvtdq2ps_avx(auVar90);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar83));
  auVar101._0_4_ = auVar82._0_4_ * auVar91._0_4_;
  auVar101._4_4_ = auVar82._4_4_ * auVar91._4_4_;
  auVar101._8_4_ = auVar82._8_4_ * auVar91._8_4_;
  auVar101._12_4_ = auVar82._12_4_ * auVar91._12_4_;
  auVar101._16_4_ = auVar91._16_4_ * 0.0;
  auVar101._20_4_ = auVar91._20_4_ * 0.0;
  auVar101._24_4_ = auVar91._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 + uVar78 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar1));
  auVar98._4_4_ = auVar91._4_4_ * auVar79._4_4_;
  auVar98._0_4_ = auVar91._0_4_ * auVar79._0_4_;
  auVar98._8_4_ = auVar91._8_4_ * auVar79._8_4_;
  auVar98._12_4_ = auVar91._12_4_ * auVar79._12_4_;
  auVar98._16_4_ = auVar91._16_4_ * 0.0;
  auVar98._20_4_ = auVar91._20_4_ * 0.0;
  auVar98._24_4_ = auVar91._24_4_ * 0.0;
  auVar98._28_4_ = auVar91._28_4_;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x17 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar1));
  auVar87._0_4_ = auVar79._0_4_ * auVar91._0_4_;
  auVar87._4_4_ = auVar79._4_4_ * auVar91._4_4_;
  auVar87._8_4_ = auVar79._8_4_ * auVar91._8_4_;
  auVar87._12_4_ = auVar79._12_4_ * auVar91._12_4_;
  auVar87._16_4_ = auVar91._16_4_ * 0.0;
  auVar87._20_4_ = auVar91._20_4_ * 0.0;
  auVar87._24_4_ = auVar91._24_4_ * 0.0;
  auVar87._28_4_ = 0;
  auVar91 = vpminsd_avx2(auVar96,auVar103);
  auVar90 = vpminsd_avx2(auVar97,auVar101);
  auVar91 = vmaxps_avx(auVar91,auVar90);
  auVar90 = vpminsd_avx2(auVar98,auVar87);
  uVar198 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar92._4_4_ = uVar198;
  auVar92._0_4_ = uVar198;
  auVar92._8_4_ = uVar198;
  auVar92._12_4_ = uVar198;
  auVar92._16_4_ = uVar198;
  auVar92._20_4_ = uVar198;
  auVar92._24_4_ = uVar198;
  auVar92._28_4_ = uVar198;
  auVar90 = vmaxps_avx512vl(auVar90,auVar92);
  auVar91 = vmaxps_avx(auVar91,auVar90);
  auVar90._8_4_ = 0x3f7ffffa;
  auVar90._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar90._12_4_ = 0x3f7ffffa;
  auVar90._16_4_ = 0x3f7ffffa;
  auVar90._20_4_ = 0x3f7ffffa;
  auVar90._24_4_ = 0x3f7ffffa;
  auVar90._28_4_ = 0x3f7ffffa;
  local_220 = vmulps_avx512vl(auVar91,auVar90);
  auVar91 = vpmaxsd_avx2(auVar96,auVar103);
  auVar90 = vpmaxsd_avx2(auVar97,auVar101);
  auVar91 = vminps_avx(auVar91,auVar90);
  auVar90 = vpmaxsd_avx2(auVar98,auVar87);
  uVar198 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar93._4_4_ = uVar198;
  auVar93._0_4_ = uVar198;
  auVar93._8_4_ = uVar198;
  auVar93._12_4_ = uVar198;
  auVar93._16_4_ = uVar198;
  auVar93._20_4_ = uVar198;
  auVar93._24_4_ = uVar198;
  auVar93._28_4_ = uVar198;
  auVar90 = vminps_avx512vl(auVar90,auVar93);
  auVar91 = vminps_avx(auVar91,auVar90);
  auVar94._8_4_ = 0x3f800003;
  auVar94._0_8_ = 0x3f8000033f800003;
  auVar94._12_4_ = 0x3f800003;
  auVar94._16_4_ = 0x3f800003;
  auVar94._20_4_ = 0x3f800003;
  auVar94._24_4_ = 0x3f800003;
  auVar94._28_4_ = 0x3f800003;
  auVar91 = vmulps_avx512vl(auVar91,auVar94);
  auVar90 = vpbroadcastd_avx512vl();
  uVar17 = vpcmpgtd_avx512vl(auVar90,_DAT_0205a920);
  uVar16 = vcmpps_avx512vl(local_220,auVar91,2);
  bVar75 = (byte)((byte)uVar16 & (byte)uVar17) == 0;
  bVar77 = !bVar75;
  if (bVar75) {
    return bVar77;
  }
  local_6c0 = (ulong)(byte)((byte)uVar16 & (byte)uVar17);
  local_470 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_6c8 = prim;
LAB_01d763a1:
  lVar73 = 0;
  for (uVar65 = local_6c0; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
    lVar73 = lVar73 + 1;
  }
  local_6b8 = (ulong)*(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[local_6b8].ptr;
  lVar5 = *(long *)&pGVar4[1].time_range.upper;
  uVar65 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)*(uint *)(prim + lVar73 * 4 + 6) *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar81 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * uVar65);
  auVar82 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * (uVar65 + 1));
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar83 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar198 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar235._4_4_ = uVar198;
  auVar235._0_4_ = uVar198;
  auVar235._8_4_ = uVar198;
  auVar235._12_4_ = uVar198;
  local_380._16_4_ = uVar198;
  local_380._0_16_ = auVar235;
  local_380._20_4_ = uVar198;
  local_380._24_4_ = uVar198;
  local_380._28_4_ = uVar198;
  local_7e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar246 = ZEXT3264(local_7e0);
  auVar79 = vunpcklps_avx512vl(auVar235,local_7e0._0_16_);
  fVar217 = *(float *)(ray + k * 4 + 0x60);
  auVar240._4_4_ = fVar217;
  auVar240._0_4_ = fVar217;
  auVar240._8_4_ = fVar217;
  auVar240._12_4_ = fVar217;
  local_3a0._16_4_ = fVar217;
  local_3a0._0_16_ = auVar240;
  local_3a0._20_4_ = fVar217;
  local_3a0._24_4_ = fVar217;
  local_3a0._28_4_ = fVar217;
  local_630 = vinsertps_avx(auVar79,auVar240,0x28);
  auVar212._8_4_ = 0xbeaaaaab;
  auVar212._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar212._12_4_ = 0xbeaaaaab;
  auVar2 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar4[2].intersectionFilterN +
                             uVar65 * (long)pGVar4[2].pointQueryFunc),auVar81,auVar212);
  auVar1 = vfmadd132ps_fma(*(undefined1 (*) [16])
                            (pGVar4[2].intersectionFilterN +
                            (long)pGVar4[2].pointQueryFunc * (uVar65 + 1)),auVar82,auVar212);
  auVar213._0_4_ = auVar82._0_4_ + auVar81._0_4_ + auVar2._0_4_ + auVar1._0_4_;
  auVar213._4_4_ = auVar82._4_4_ + auVar81._4_4_ + auVar2._4_4_ + auVar1._4_4_;
  auVar213._8_4_ = auVar82._8_4_ + auVar81._8_4_ + auVar2._8_4_ + auVar1._8_4_;
  auVar213._12_4_ = auVar82._12_4_ + auVar81._12_4_ + auVar2._12_4_ + auVar1._12_4_;
  auVar14._8_4_ = 0x3e800000;
  auVar14._0_8_ = 0x3e8000003e800000;
  auVar14._12_4_ = 0x3e800000;
  auVar79 = vmulps_avx512vl(auVar213,auVar14);
  auVar79 = vsubps_avx(auVar79,auVar83);
  auVar79 = vdpps_avx(auVar79,local_630,0x7f);
  fVar136 = *(float *)(ray + k * 4 + 0x30);
  local_640 = vdpps_avx(local_630,local_630,0x7f);
  local_450 = vpbroadcastd_avx512vl();
  auVar218._4_12_ = ZEXT812(0) << 0x20;
  auVar218._0_4_ = local_640._0_4_;
  auVar80 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar218);
  auVar84 = vfnmadd213ss_fma(auVar80,local_640,ZEXT416(0x40000000));
  local_200 = auVar79._0_4_ * auVar80._0_4_ * auVar84._0_4_;
  auVar219._4_4_ = local_200;
  auVar219._0_4_ = local_200;
  auVar219._8_4_ = local_200;
  auVar219._12_4_ = local_200;
  fStack_350 = local_200;
  _local_360 = auVar219;
  fStack_34c = local_200;
  fStack_348 = local_200;
  fStack_344 = local_200;
  auVar79 = vfmadd231ps_fma(auVar83,local_630,auVar219);
  auVar79 = vblendps_avx(auVar79,ZEXT816(0) << 0x40,8);
  auVar81 = vsubps_avx(auVar81,auVar79);
  auVar83 = vsubps_avx(auVar1,auVar79);
  auVar1 = vsubps_avx(auVar2,auVar79);
  auVar82 = vsubps_avx(auVar82,auVar79);
  uVar198 = auVar81._0_4_;
  local_620._4_4_ = uVar198;
  local_620._0_4_ = uVar198;
  local_620._8_4_ = uVar198;
  local_620._12_4_ = uVar198;
  local_620._16_4_ = uVar198;
  local_620._20_4_ = uVar198;
  local_620._24_4_ = uVar198;
  local_620._28_4_ = uVar198;
  auVar230 = ZEXT3264(local_620);
  auVar109._8_4_ = 1;
  auVar109._0_8_ = 0x100000001;
  auVar109._12_4_ = 1;
  auVar109._16_4_ = 1;
  auVar109._20_4_ = 1;
  auVar109._24_4_ = 1;
  auVar109._28_4_ = 1;
  local_4e0 = ZEXT1632(auVar81);
  local_7c0 = vpermps_avx2(auVar109,local_4e0);
  auVar232 = ZEXT3264(local_7c0);
  auVar110._8_4_ = 2;
  auVar110._0_8_ = 0x200000002;
  auVar110._12_4_ = 2;
  auVar110._16_4_ = 2;
  auVar110._20_4_ = 2;
  auVar110._24_4_ = 2;
  auVar110._28_4_ = 2;
  local_800 = vpermps_avx512vl(auVar110,local_4e0);
  auVar251 = ZEXT3264(local_800);
  auVar113._8_4_ = 3;
  auVar113._0_8_ = 0x300000003;
  auVar113._12_4_ = 3;
  auVar113._16_4_ = 3;
  auVar113._20_4_ = 3;
  auVar113._24_4_ = 3;
  auVar113._28_4_ = 3;
  local_700 = vpermps_avx512vl(auVar113,local_4e0);
  auVar250 = ZEXT3264(local_700);
  uVar198 = auVar1._0_4_;
  local_560._4_4_ = uVar198;
  local_560._0_4_ = uVar198;
  local_560._8_4_ = uVar198;
  local_560._12_4_ = uVar198;
  local_560._16_4_ = uVar198;
  local_560._20_4_ = uVar198;
  local_560._24_4_ = uVar198;
  local_560._28_4_ = uVar198;
  local_520 = ZEXT1632(auVar1);
  local_680 = vpermps_avx2(auVar109,local_520);
  local_720 = vpermps_avx512vl(auVar110,local_520);
  auVar241 = ZEXT3264(local_720);
  local_820 = vpermps_avx512vl(auVar113,local_520);
  auVar242 = ZEXT3264(local_820);
  local_840 = vbroadcastss_avx512vl(auVar83);
  auVar243 = ZEXT3264(local_840);
  local_500 = ZEXT1632(auVar83);
  local_740 = vpermps_avx512vl(auVar109,local_500);
  auVar244 = ZEXT3264(local_740);
  local_760 = vpermps_avx512vl(auVar110,local_500);
  auVar245 = ZEXT3264(local_760);
  local_860 = vpermps_avx512vl(auVar113,local_500);
  auVar247 = ZEXT3264(local_860);
  auVar211 = ZEXT3264(local_680);
  local_880 = vbroadcastss_avx512vl(auVar82);
  auVar248 = ZEXT3264(local_880);
  _local_540 = ZEXT1632(auVar82);
  local_780 = vpermps_avx512vl(auVar109,_local_540);
  auVar249 = ZEXT3264(local_780);
  local_8a0 = vpermps_avx512vl(auVar110,_local_540);
  auVar254 = ZEXT3264(local_8a0);
  local_7a0 = vpermps_avx512vl(auVar113,_local_540);
  auVar252 = ZEXT3264(local_7a0);
  auVar196 = ZEXT3264(local_560);
  local_2a0 = vfmadd231ps_avx512vl(ZEXT432((uint)(fVar217 * fVar217)),local_7e0,local_7e0);
  auVar81 = vfmadd231ps_fma(local_2a0,local_380,local_380);
  local_1e0._0_4_ = auVar81._0_4_;
  local_1e0._4_4_ = local_1e0._0_4_;
  local_1e0._8_4_ = local_1e0._0_4_;
  local_1e0._12_4_ = local_1e0._0_4_;
  local_1e0._16_4_ = local_1e0._0_4_;
  local_1e0._20_4_ = local_1e0._0_4_;
  local_1e0._24_4_ = local_1e0._0_4_;
  local_1e0._28_4_ = local_1e0._0_4_;
  vandps_avx512vl(local_1e0,auVar253._0_32_);
  local_5c0 = ZEXT416((uint)local_200);
  local_200 = fVar136 - local_200;
  fStack_1fc = local_200;
  fStack_1f8 = local_200;
  fStack_1f4 = local_200;
  fStack_1f0 = local_200;
  fStack_1ec = local_200;
  fStack_1e8 = local_200;
  fStack_1e4 = local_200;
  uVar65 = 0;
  bVar71 = 0;
  iVar70 = 1;
  local_460 = vpbroadcastd_avx512vl();
  auVar81 = vsqrtss_avx(local_640,local_640);
  local_8a4 = auVar81._0_4_;
  auVar81 = vsqrtss_avx(local_640,local_640);
  local_8a8 = auVar81._0_4_;
  local_5e0 = ZEXT816(0x3f80000000000000);
  auVar204 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar81 = vmovshdup_avx(local_5e0);
    auVar216._0_4_ = local_5e0._0_4_;
    fVar137 = auVar81._0_4_ - auVar216._0_4_;
    fVar233 = fVar137 * 0.04761905;
    auVar216._4_4_ = auVar216._0_4_;
    auVar216._8_4_ = auVar216._0_4_;
    auVar216._12_4_ = auVar216._0_4_;
    auVar216._16_4_ = auVar216._0_4_;
    auVar216._20_4_ = auVar216._0_4_;
    auVar216._24_4_ = auVar216._0_4_;
    auVar216._28_4_ = auVar216._0_4_;
    local_660._4_4_ = fVar137;
    local_660._0_4_ = fVar137;
    local_660._8_4_ = fVar137;
    local_660._12_4_ = fVar137;
    local_660._16_4_ = fVar137;
    local_660._20_4_ = fVar137;
    local_660._24_4_ = fVar137;
    local_660._28_4_ = fVar137;
    auVar81 = vfmadd231ps_fma(auVar216,local_660,_DAT_02020f20);
    auVar113 = auVar204._0_32_;
    auVar91 = vsubps_avx(auVar113,ZEXT1632(auVar81));
    fVar217 = auVar81._0_4_;
    auVar168._0_4_ = auVar196._0_4_ * fVar217;
    fVar224 = auVar81._4_4_;
    auVar168._4_4_ = auVar196._4_4_ * fVar224;
    fVar225 = auVar81._8_4_;
    auVar168._8_4_ = auVar196._8_4_ * fVar225;
    fVar226 = auVar81._12_4_;
    auVar168._12_4_ = auVar196._12_4_ * fVar226;
    auVar168._16_4_ = auVar196._16_4_ * 0.0;
    auVar168._20_4_ = auVar196._20_4_ * 0.0;
    auVar168._24_4_ = auVar196._24_4_ * 0.0;
    auVar168._28_4_ = 0;
    auVar93 = ZEXT1632(auVar81);
    auVar253._0_4_ = auVar211._0_4_ * fVar217;
    auVar253._4_4_ = auVar211._4_4_ * fVar224;
    auVar253._8_4_ = auVar211._8_4_ * fVar225;
    auVar253._12_4_ = auVar211._12_4_ * fVar226;
    auVar253._16_4_ = auVar211._16_4_ * 0.0;
    auVar253._20_4_ = auVar211._20_4_ * 0.0;
    auVar253._28_36_ = auVar196._28_36_;
    auVar253._24_4_ = auVar211._24_4_ * 0.0;
    auVar90 = vmulps_avx512vl(auVar241._0_32_,auVar93);
    auVar92 = vmulps_avx512vl(auVar242._0_32_,auVar93);
    auVar82 = vfmadd231ps_fma(auVar168,auVar91,auVar230._0_32_);
    auVar79 = vfmadd231ps_fma(auVar253._0_32_,auVar91,auVar232._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar91,auVar251._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar91,auVar250._0_32_);
    auVar93 = vmulps_avx512vl(auVar243._0_32_,auVar93);
    auVar99 = ZEXT1632(auVar81);
    auVar94 = vmulps_avx512vl(auVar244._0_32_,auVar99);
    auVar95 = vmulps_avx512vl(auVar245._0_32_,auVar99);
    auVar96 = vmulps_avx512vl(auVar247._0_32_,auVar99);
    auVar83 = vfmadd231ps_fma(auVar93,auVar91,auVar196._0_32_);
    auVar1 = vfmadd231ps_fma(auVar94,auVar91,auVar211._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar95,auVar91,auVar241._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar96,auVar91,auVar242._0_32_);
    auVar95 = vmulps_avx512vl(auVar248._0_32_,auVar99);
    auVar96 = vmulps_avx512vl(auVar249._0_32_,auVar99);
    auVar97 = vmulps_avx512vl(auVar254._0_32_,auVar99);
    auVar98 = vmulps_avx512vl(auVar252._0_32_,auVar99);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,auVar243._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,auVar244._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar91,auVar245._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar91,auVar247._0_32_);
    auVar99 = vmulps_avx512vl(auVar99,ZEXT1632(auVar83));
    auVar86 = ZEXT1632(auVar81);
    auVar88 = vmulps_avx512vl(auVar86,ZEXT1632(auVar1));
    auVar89 = vmulps_avx512vl(auVar86,auVar93);
    auVar100 = vmulps_avx512vl(auVar86,auVar94);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar91,ZEXT1632(auVar82));
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,ZEXT1632(auVar79));
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar91,auVar90);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar91,auVar92);
    auVar169._0_4_ = auVar95._0_4_ * fVar217;
    auVar169._4_4_ = auVar95._4_4_ * fVar224;
    auVar169._8_4_ = auVar95._8_4_ * fVar225;
    auVar169._12_4_ = auVar95._12_4_ * fVar226;
    auVar169._16_4_ = auVar95._16_4_ * 0.0;
    auVar169._20_4_ = auVar95._20_4_ * 0.0;
    auVar169._24_4_ = auVar95._24_4_ * 0.0;
    auVar169._28_4_ = 0;
    auVar255._4_4_ = auVar96._4_4_ * fVar224;
    auVar255._0_4_ = auVar96._0_4_ * fVar217;
    auVar255._8_4_ = auVar96._8_4_ * fVar225;
    auVar255._12_4_ = auVar96._12_4_ * fVar226;
    auVar255._16_4_ = auVar96._16_4_ * 0.0;
    auVar255._20_4_ = auVar96._20_4_ * 0.0;
    auVar255._24_4_ = auVar96._24_4_ * 0.0;
    auVar255._28_4_ = auVar95._28_4_;
    auVar37._4_4_ = auVar97._4_4_ * fVar224;
    auVar37._0_4_ = auVar97._0_4_ * fVar217;
    auVar37._8_4_ = auVar97._8_4_ * fVar225;
    auVar37._12_4_ = auVar97._12_4_ * fVar226;
    auVar37._16_4_ = auVar97._16_4_ * 0.0;
    auVar37._20_4_ = auVar97._20_4_ * 0.0;
    auVar37._24_4_ = auVar97._24_4_ * 0.0;
    auVar37._28_4_ = auVar96._28_4_;
    auVar38._4_4_ = auVar98._4_4_ * fVar224;
    auVar38._0_4_ = auVar98._0_4_ * fVar217;
    auVar38._8_4_ = auVar98._8_4_ * fVar225;
    auVar38._12_4_ = auVar98._12_4_ * fVar226;
    auVar38._16_4_ = auVar98._16_4_ * 0.0;
    auVar38._20_4_ = auVar98._20_4_ * 0.0;
    auVar38._24_4_ = auVar98._24_4_ * 0.0;
    auVar38._28_4_ = auVar97._28_4_;
    auVar81 = vfmadd231ps_fma(auVar169,auVar91,ZEXT1632(auVar83));
    auVar82 = vfmadd231ps_fma(auVar255,auVar91,ZEXT1632(auVar1));
    auVar79 = vfmadd231ps_fma(auVar37,auVar91,auVar93);
    auVar83 = vfmadd231ps_fma(auVar38,auVar91,auVar94);
    auVar39._28_4_ = auVar92._28_4_;
    auVar39._0_28_ =
         ZEXT1628(CONCAT412(fVar226 * auVar81._12_4_,
                            CONCAT48(fVar225 * auVar81._8_4_,
                                     CONCAT44(fVar224 * auVar81._4_4_,fVar217 * auVar81._0_4_))));
    auVar40._28_4_ = auVar90._28_4_;
    auVar40._0_28_ =
         ZEXT1628(CONCAT412(auVar82._12_4_ * fVar226,
                            CONCAT48(auVar82._8_4_ * fVar225,
                                     CONCAT44(auVar82._4_4_ * fVar224,auVar82._0_4_ * fVar217))));
    auVar90 = vmulps_avx512vl(auVar86,ZEXT1632(auVar79));
    auVar95 = vfmadd231ps_avx512vl(auVar39,auVar91,auVar99);
    auVar96 = vfmadd231ps_avx512vl(auVar40,auVar91,auVar88);
    local_600 = vfmadd231ps_avx512vl(auVar90,auVar91,auVar89);
    auVar92 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar83._12_4_ * fVar226,
                                            CONCAT48(auVar83._8_4_ * fVar225,
                                                     CONCAT44(auVar83._4_4_ * fVar224,
                                                              auVar83._0_4_ * fVar217)))),auVar100,
                         auVar91);
    auVar91 = vsubps_avx512vl(ZEXT1632(auVar81),auVar99);
    auVar90 = vsubps_avx512vl(ZEXT1632(auVar82),auVar88);
    auVar93 = vsubps_avx512vl(ZEXT1632(auVar79),auVar89);
    auVar97 = vsubps_avx512vl(ZEXT1632(auVar83),auVar100);
    auVar41._4_4_ = fVar233 * auVar91._4_4_ * 3.0;
    auVar41._0_4_ = fVar233 * auVar91._0_4_ * 3.0;
    auVar41._8_4_ = fVar233 * auVar91._8_4_ * 3.0;
    auVar41._12_4_ = fVar233 * auVar91._12_4_ * 3.0;
    auVar41._16_4_ = fVar233 * auVar91._16_4_ * 3.0;
    auVar41._20_4_ = fVar233 * auVar91._20_4_ * 3.0;
    auVar41._24_4_ = fVar233 * auVar91._24_4_ * 3.0;
    auVar41._28_4_ = auVar94._28_4_;
    auVar236._0_4_ = fVar233 * auVar90._0_4_ * 3.0;
    auVar236._4_4_ = fVar233 * auVar90._4_4_ * 3.0;
    auVar236._8_4_ = fVar233 * auVar90._8_4_ * 3.0;
    auVar236._12_4_ = fVar233 * auVar90._12_4_ * 3.0;
    auVar236._16_4_ = fVar233 * auVar90._16_4_ * 3.0;
    auVar236._20_4_ = fVar233 * auVar90._20_4_ * 3.0;
    auVar236._24_4_ = fVar233 * auVar90._24_4_ * 3.0;
    auVar236._28_4_ = 0;
    auVar239._0_4_ = auVar93._0_4_ * 3.0 * fVar233;
    auVar239._4_4_ = auVar93._4_4_ * 3.0 * fVar233;
    auVar239._8_4_ = auVar93._8_4_ * 3.0 * fVar233;
    auVar239._12_4_ = auVar93._12_4_ * 3.0 * fVar233;
    auVar239._16_4_ = auVar93._16_4_ * 3.0 * fVar233;
    auVar239._20_4_ = auVar93._20_4_ * 3.0 * fVar233;
    auVar239._24_4_ = auVar93._24_4_ * 3.0 * fVar233;
    auVar239._28_4_ = 0;
    fVar217 = auVar97._0_4_ * 3.0 * fVar233;
    fVar224 = auVar97._4_4_ * 3.0 * fVar233;
    auVar42._4_4_ = fVar224;
    auVar42._0_4_ = fVar217;
    fVar225 = auVar97._8_4_ * 3.0 * fVar233;
    auVar42._8_4_ = fVar225;
    fVar226 = auVar97._12_4_ * 3.0 * fVar233;
    auVar42._12_4_ = fVar226;
    fVar227 = auVar97._16_4_ * 3.0 * fVar233;
    auVar42._16_4_ = fVar227;
    fVar197 = auVar97._20_4_ * 3.0 * fVar233;
    auVar42._20_4_ = fVar197;
    fVar228 = auVar97._24_4_ * 3.0 * fVar233;
    auVar42._24_4_ = fVar228;
    auVar42._28_4_ = fVar233;
    auVar81 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar94 = vpermt2ps_avx512vl(auVar95,_DAT_0205fd20,ZEXT1632(auVar81));
    auVar97 = vpermt2ps_avx512vl(auVar96,_DAT_0205fd20,ZEXT1632(auVar81));
    auVar93 = ZEXT1632(auVar81);
    auVar98 = vpermt2ps_avx512vl(local_600,_DAT_0205fd20,auVar93);
    auVar170._0_4_ = auVar92._0_4_ + fVar217;
    auVar170._4_4_ = auVar92._4_4_ + fVar224;
    auVar170._8_4_ = auVar92._8_4_ + fVar225;
    auVar170._12_4_ = auVar92._12_4_ + fVar226;
    auVar170._16_4_ = auVar92._16_4_ + fVar227;
    auVar170._20_4_ = auVar92._20_4_ + fVar197;
    auVar170._24_4_ = auVar92._24_4_ + fVar228;
    auVar170._28_4_ = auVar92._28_4_ + fVar233;
    auVar91 = vmaxps_avx(auVar92,auVar170);
    auVar90 = vminps_avx(auVar92,auVar170);
    auVar99 = vpermt2ps_avx512vl(auVar92,_DAT_0205fd20,auVar93);
    auVar88 = vpermt2ps_avx512vl(auVar41,_DAT_0205fd20,auVar93);
    auVar89 = vpermt2ps_avx512vl(auVar236,_DAT_0205fd20,auVar93);
    auVar255 = ZEXT1632(auVar81);
    auVar100 = vpermt2ps_avx512vl(auVar239,_DAT_0205fd20,auVar255);
    auVar92 = vpermt2ps_avx512vl(auVar42,_DAT_0205fd20,auVar255);
    auVar86 = vsubps_avx512vl(auVar99,auVar92);
    auVar92 = vsubps_avx(auVar94,auVar95);
    auVar93 = vsubps_avx(auVar97,auVar96);
    auVar87 = vsubps_avx512vl(auVar98,local_600);
    auVar101 = vmulps_avx512vl(auVar93,auVar239);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar236,auVar87);
    auVar102 = vmulps_avx512vl(auVar87,auVar41);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar239,auVar92);
    auVar103 = vmulps_avx512vl(auVar92,auVar236);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar41,auVar93);
    auVar103 = vmulps_avx512vl(auVar103,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar101);
    auVar102 = vmulps_avx512vl(auVar87,auVar87);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar93,auVar93);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar92,auVar92);
    auVar103 = vrcp14ps_avx512vl(auVar102);
    auVar104 = vfnmadd213ps_avx512vl(auVar103,auVar102,auVar113);
    auVar103 = vfmadd132ps_avx512vl(auVar104,auVar103,auVar103);
    auVar101 = vmulps_avx512vl(auVar101,auVar103);
    auVar104 = vmulps_avx512vl(auVar93,auVar100);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar89,auVar87);
    auVar105 = vmulps_avx512vl(auVar87,auVar88);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar100,auVar92);
    auVar106 = vmulps_avx512vl(auVar92,auVar89);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar88,auVar93);
    auVar106 = vmulps_avx512vl(auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar103 = vmulps_avx512vl(auVar104,auVar103);
    auVar101 = vmaxps_avx512vl(auVar101,auVar103);
    auVar101 = vsqrtps_avx512vl(auVar101);
    auVar103 = vmaxps_avx512vl(auVar86,auVar99);
    auVar91 = vmaxps_avx512vl(auVar91,auVar103);
    auVar103 = vaddps_avx512vl(auVar101,auVar91);
    auVar91 = vminps_avx512vl(auVar86,auVar99);
    auVar91 = vminps_avx(auVar90,auVar91);
    auVar91 = vsubps_avx512vl(auVar91,auVar101);
    auVar111._8_4_ = 0x3f800002;
    auVar111._0_8_ = 0x3f8000023f800002;
    auVar111._12_4_ = 0x3f800002;
    auVar111._16_4_ = 0x3f800002;
    auVar111._20_4_ = 0x3f800002;
    auVar111._24_4_ = 0x3f800002;
    auVar111._28_4_ = 0x3f800002;
    auVar90 = vmulps_avx512vl(auVar103,auVar111);
    auVar112._8_4_ = 0x3f7ffffc;
    auVar112._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar112._12_4_ = 0x3f7ffffc;
    auVar112._16_4_ = 0x3f7ffffc;
    auVar112._20_4_ = 0x3f7ffffc;
    auVar112._24_4_ = 0x3f7ffffc;
    auVar112._28_4_ = 0x3f7ffffc;
    auVar91 = vmulps_avx512vl(auVar91,auVar112);
    auVar43._4_4_ = auVar90._4_4_ * auVar90._4_4_;
    auVar43._0_4_ = auVar90._0_4_ * auVar90._0_4_;
    auVar43._8_4_ = auVar90._8_4_ * auVar90._8_4_;
    auVar43._12_4_ = auVar90._12_4_ * auVar90._12_4_;
    auVar43._16_4_ = auVar90._16_4_ * auVar90._16_4_;
    auVar43._20_4_ = auVar90._20_4_ * auVar90._20_4_;
    auVar43._24_4_ = auVar90._24_4_ * auVar90._24_4_;
    auVar43._28_4_ = auVar91._28_4_;
    auVar90 = vrsqrt14ps_avx512vl(auVar102);
    auVar118._8_4_ = 0xbf000000;
    auVar118._0_8_ = 0xbf000000bf000000;
    auVar118._12_4_ = 0xbf000000;
    auVar118._16_4_ = 0xbf000000;
    auVar118._20_4_ = 0xbf000000;
    auVar118._24_4_ = 0xbf000000;
    auVar118._28_4_ = 0xbf000000;
    auVar99 = vmulps_avx512vl(auVar102,auVar118);
    auVar44._4_4_ = auVar90._4_4_ * auVar99._4_4_;
    auVar44._0_4_ = auVar90._0_4_ * auVar99._0_4_;
    auVar44._8_4_ = auVar90._8_4_ * auVar99._8_4_;
    auVar44._12_4_ = auVar90._12_4_ * auVar99._12_4_;
    auVar44._16_4_ = auVar90._16_4_ * auVar99._16_4_;
    auVar44._20_4_ = auVar90._20_4_ * auVar99._20_4_;
    auVar44._24_4_ = auVar90._24_4_ * auVar99._24_4_;
    auVar44._28_4_ = auVar99._28_4_;
    auVar99 = vmulps_avx512vl(auVar90,auVar90);
    auVar99 = vmulps_avx512vl(auVar99,auVar44);
    auVar119._8_4_ = 0x3fc00000;
    auVar119._0_8_ = 0x3fc000003fc00000;
    auVar119._12_4_ = 0x3fc00000;
    auVar119._16_4_ = 0x3fc00000;
    auVar119._20_4_ = 0x3fc00000;
    auVar119._24_4_ = 0x3fc00000;
    auVar119._28_4_ = 0x3fc00000;
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar90,auVar119);
    auVar45._4_4_ = auVar99._4_4_ * auVar92._4_4_;
    auVar45._0_4_ = auVar99._0_4_ * auVar92._0_4_;
    auVar45._8_4_ = auVar99._8_4_ * auVar92._8_4_;
    auVar45._12_4_ = auVar99._12_4_ * auVar92._12_4_;
    auVar45._16_4_ = auVar99._16_4_ * auVar92._16_4_;
    auVar45._20_4_ = auVar99._20_4_ * auVar92._20_4_;
    auVar45._24_4_ = auVar99._24_4_ * auVar92._24_4_;
    auVar45._28_4_ = auVar90._28_4_;
    auVar90 = vmulps_avx512vl(auVar93,auVar99);
    auVar86 = vmulps_avx512vl(auVar87,auVar99);
    auVar101 = vsubps_avx512vl(auVar255,auVar95);
    auVar102 = vsubps_avx512vl(auVar255,auVar96);
    auVar103 = vsubps_avx512vl(auVar255,local_600);
    auVar104 = vmulps_avx512vl(local_3a0,auVar103);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar246._0_32_,auVar102);
    auVar104 = vfmadd231ps_avx512vl(auVar104,local_380,auVar101);
    auVar105 = vmulps_avx512vl(auVar103,auVar103);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,auVar102);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar101);
    auVar106 = vmulps_avx512vl(local_3a0,auVar86);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar90,auVar246._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar45,local_380);
    auVar86 = vmulps_avx512vl(auVar103,auVar86);
    auVar90 = vfmadd231ps_avx512vl(auVar86,auVar102,auVar90);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar101,auVar45);
    local_4a0 = vmulps_avx512vl(auVar106,auVar106);
    auVar86 = vsubps_avx512vl(local_1e0,local_4a0);
    auVar107 = vmulps_avx512vl(auVar106,auVar90);
    auVar104 = vsubps_avx512vl(auVar104,auVar107);
    auVar104 = vaddps_avx512vl(auVar104,auVar104);
    auVar107 = vmulps_avx512vl(auVar90,auVar90);
    auVar105 = vsubps_avx512vl(auVar105,auVar107);
    auVar107 = vsubps_avx512vl(auVar105,auVar43);
    auVar108 = vmulps_avx512vl(auVar104,auVar104);
    auVar116._8_4_ = 0x40800000;
    auVar116._0_8_ = 0x4080000040800000;
    auVar116._12_4_ = 0x40800000;
    auVar116._16_4_ = 0x40800000;
    auVar116._20_4_ = 0x40800000;
    auVar116._24_4_ = 0x40800000;
    auVar116._28_4_ = 0x40800000;
    auVar109 = vmulps_avx512vl(auVar86,auVar116);
    auVar110 = vmulps_avx512vl(auVar109,auVar107);
    auVar110 = vsubps_avx512vl(auVar108,auVar110);
    uVar78 = vcmpps_avx512vl(auVar110,auVar255,5);
    bVar67 = (byte)uVar78;
    if (bVar67 == 0) {
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar110 = vsqrtps_avx512vl(auVar110);
      auVar111 = vaddps_avx512vl(auVar86,auVar86);
      auVar112 = vrcp14ps_avx512vl(auVar111);
      auVar113 = vfnmadd213ps_avx512vl(auVar111,auVar112,auVar113);
      auVar113 = vfmadd132ps_avx512vl(auVar113,auVar112,auVar112);
      auVar26._8_4_ = 0x80000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar26._12_4_ = 0x80000000;
      auVar26._16_4_ = 0x80000000;
      auVar26._20_4_ = 0x80000000;
      auVar26._24_4_ = 0x80000000;
      auVar26._28_4_ = 0x80000000;
      auVar111 = vxorps_avx512vl(auVar104,auVar26);
      auVar111 = vsubps_avx512vl(auVar111,auVar110);
      auVar111 = vmulps_avx512vl(auVar111,auVar113);
      auVar110 = vsubps_avx512vl(auVar110,auVar104);
      auVar110 = vmulps_avx512vl(auVar110,auVar113);
      auVar113 = vfmadd213ps_avx512vl(auVar106,auVar111,auVar90);
      local_2e0 = vmulps_avx512vl(auVar99,auVar113);
      auVar113 = vfmadd213ps_avx512vl(auVar106,auVar110,auVar90);
      local_300 = vmulps_avx512vl(auVar99,auVar113);
      auVar144._8_4_ = 0x7f800000;
      auVar144._0_8_ = 0x7f8000007f800000;
      auVar144._12_4_ = 0x7f800000;
      auVar144._16_4_ = 0x7f800000;
      auVar144._20_4_ = 0x7f800000;
      auVar144._24_4_ = 0x7f800000;
      auVar144._28_4_ = 0x7f800000;
      auVar113 = vblendmps_avx512vl(auVar144,auVar111);
      auVar114._0_4_ =
           (uint)(bVar67 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar67 & 1) * local_300._0_4_;
      bVar75 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar75 * auVar113._4_4_ | (uint)!bVar75 * local_300._4_4_;
      bVar75 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar75 * auVar113._8_4_ | (uint)!bVar75 * local_300._8_4_;
      bVar75 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar75 * auVar113._12_4_ | (uint)!bVar75 * local_300._12_4_;
      bVar75 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar114._16_4_ = (uint)bVar75 * auVar113._16_4_ | (uint)!bVar75 * local_300._16_4_;
      bVar75 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar114._20_4_ = (uint)bVar75 * auVar113._20_4_ | (uint)!bVar75 * local_300._20_4_;
      bVar75 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar114._24_4_ = (uint)bVar75 * auVar113._24_4_ | (uint)!bVar75 * local_300._24_4_;
      bVar75 = SUB81(uVar78 >> 7,0);
      auVar114._28_4_ = (uint)bVar75 * auVar113._28_4_ | (uint)!bVar75 * local_300._28_4_;
      auVar145._8_4_ = 0xff800000;
      auVar145._0_8_ = 0xff800000ff800000;
      auVar145._12_4_ = 0xff800000;
      auVar145._16_4_ = 0xff800000;
      auVar145._20_4_ = 0xff800000;
      auVar145._24_4_ = 0xff800000;
      auVar145._28_4_ = 0xff800000;
      auVar113 = vblendmps_avx512vl(auVar145,auVar110);
      auVar115._0_4_ =
           (uint)(bVar67 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar110._0_4_;
      bVar75 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar75 * auVar113._4_4_ | (uint)!bVar75 * auVar110._4_4_;
      bVar75 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar75 * auVar113._8_4_ | (uint)!bVar75 * auVar110._8_4_;
      bVar75 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar75 * auVar113._12_4_ | (uint)!bVar75 * auVar110._12_4_;
      bVar75 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar75 * auVar113._16_4_ | (uint)!bVar75 * auVar110._16_4_;
      bVar75 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar75 * auVar113._20_4_ | (uint)!bVar75 * auVar110._20_4_;
      bVar75 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar75 * auVar113._24_4_ | (uint)!bVar75 * auVar110._24_4_;
      bVar75 = SUB81(uVar78 >> 7,0);
      auVar115._28_4_ = (uint)bVar75 * auVar113._28_4_ | (uint)!bVar75 * auVar110._28_4_;
      auVar146._8_4_ = 0x7fffffff;
      auVar146._0_8_ = 0x7fffffff7fffffff;
      auVar146._12_4_ = 0x7fffffff;
      auVar146._16_4_ = 0x7fffffff;
      auVar146._20_4_ = 0x7fffffff;
      auVar146._24_4_ = 0x7fffffff;
      auVar146._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_4a0,auVar146);
      auVar110 = vmaxps_avx512vl(local_2a0,local_4a0);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      auVar113 = vmulps_avx512vl(auVar110,auVar27);
      auVar110 = vandps_avx(auVar86,auVar146);
      uVar68 = vcmpps_avx512vl(auVar110,auVar113,1);
      uVar78 = uVar78 & uVar68;
      bVar72 = (byte)uVar78;
      if (bVar72 != 0) {
        uVar68 = vcmpps_avx512vl(auVar107,_DAT_02020f00,2);
        auVar176._8_4_ = 0xff800000;
        auVar176._0_8_ = 0xff800000ff800000;
        auVar176._12_4_ = 0xff800000;
        auVar176._16_4_ = 0xff800000;
        auVar176._20_4_ = 0xff800000;
        auVar176._24_4_ = 0xff800000;
        auVar176._28_4_ = 0xff800000;
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar113 = vblendmps_avx512vl(auVar107,auVar176);
        bVar66 = (byte)uVar68;
        uVar69 = (uint)(bVar66 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar110._0_4_;
        bVar75 = (bool)((byte)(uVar68 >> 1) & 1);
        uVar129 = (uint)bVar75 * auVar113._4_4_ | (uint)!bVar75 * auVar110._4_4_;
        bVar75 = (bool)((byte)(uVar68 >> 2) & 1);
        uVar130 = (uint)bVar75 * auVar113._8_4_ | (uint)!bVar75 * auVar110._8_4_;
        bVar75 = (bool)((byte)(uVar68 >> 3) & 1);
        uVar131 = (uint)bVar75 * auVar113._12_4_ | (uint)!bVar75 * auVar110._12_4_;
        bVar75 = (bool)((byte)(uVar68 >> 4) & 1);
        uVar132 = (uint)bVar75 * auVar113._16_4_ | (uint)!bVar75 * auVar110._16_4_;
        bVar75 = (bool)((byte)(uVar68 >> 5) & 1);
        uVar133 = (uint)bVar75 * auVar113._20_4_ | (uint)!bVar75 * auVar110._20_4_;
        bVar75 = (bool)((byte)(uVar68 >> 6) & 1);
        uVar134 = (uint)bVar75 * auVar113._24_4_ | (uint)!bVar75 * auVar110._24_4_;
        bVar75 = SUB81(uVar68 >> 7,0);
        uVar135 = (uint)bVar75 * auVar113._28_4_ | (uint)!bVar75 * auVar110._28_4_;
        auVar114._0_4_ = (bVar72 & 1) * uVar69 | !(bool)(bVar72 & 1) * auVar114._0_4_;
        bVar75 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar114._4_4_ = bVar75 * uVar129 | !bVar75 * auVar114._4_4_;
        bVar75 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar114._8_4_ = bVar75 * uVar130 | !bVar75 * auVar114._8_4_;
        bVar75 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar114._12_4_ = bVar75 * uVar131 | !bVar75 * auVar114._12_4_;
        bVar75 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar114._16_4_ = bVar75 * uVar132 | !bVar75 * auVar114._16_4_;
        bVar75 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar114._20_4_ = bVar75 * uVar133 | !bVar75 * auVar114._20_4_;
        bVar75 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar114._24_4_ = bVar75 * uVar134 | !bVar75 * auVar114._24_4_;
        bVar75 = SUB81(uVar78 >> 7,0);
        auVar114._28_4_ = bVar75 * uVar135 | !bVar75 * auVar114._28_4_;
        auVar107 = vblendmps_avx512vl(auVar176,auVar107);
        bVar75 = (bool)((byte)(uVar68 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar68 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar68 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar68 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar68 >> 6) & 1);
        bVar13 = SUB81(uVar68 >> 7,0);
        auVar115._0_4_ =
             (uint)(bVar72 & 1) *
             ((uint)(bVar66 & 1) * auVar107._0_4_ | !(bool)(bVar66 & 1) * uVar69) |
             !(bool)(bVar72 & 1) * auVar115._0_4_;
        bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar115._4_4_ =
             (uint)bVar7 * ((uint)bVar75 * auVar107._4_4_ | !bVar75 * uVar129) |
             !bVar7 * auVar115._4_4_;
        bVar75 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar115._8_4_ =
             (uint)bVar75 * ((uint)bVar8 * auVar107._8_4_ | !bVar8 * uVar130) |
             !bVar75 * auVar115._8_4_;
        bVar75 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar115._12_4_ =
             (uint)bVar75 * ((uint)bVar9 * auVar107._12_4_ | !bVar9 * uVar131) |
             !bVar75 * auVar115._12_4_;
        bVar75 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar115._16_4_ =
             (uint)bVar75 * ((uint)bVar10 * auVar107._16_4_ | !bVar10 * uVar132) |
             !bVar75 * auVar115._16_4_;
        bVar75 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar115._20_4_ =
             (uint)bVar75 * ((uint)bVar11 * auVar107._20_4_ | !bVar11 * uVar133) |
             !bVar75 * auVar115._20_4_;
        bVar75 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar115._24_4_ =
             (uint)bVar75 * ((uint)bVar12 * auVar107._24_4_ | !bVar12 * uVar134) |
             !bVar75 * auVar115._24_4_;
        bVar75 = SUB81(uVar78 >> 7,0);
        auVar115._28_4_ =
             (uint)bVar75 * ((uint)bVar13 * auVar107._28_4_ | !bVar13 * uVar135) |
             !bVar75 * auVar115._28_4_;
        bVar67 = (~bVar72 | bVar66) & bVar67;
      }
    }
    in_ZMM31 = ZEXT3264(auVar115);
    if ((bVar67 & 0x7f) == 0) {
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar253 = ZEXT3264(auVar91);
      auVar117._8_4_ = 0x3f800000;
      auVar117._0_8_ = &DAT_3f8000003f800000;
      auVar117._12_4_ = 0x3f800000;
      auVar117._16_4_ = 0x3f800000;
      auVar117._20_4_ = 0x3f800000;
      auVar117._24_4_ = 0x3f800000;
      auVar117._28_4_ = 0x3f800000;
LAB_01d77039:
      auVar204 = ZEXT3264(auVar117);
      auVar246 = ZEXT3264(local_7e0);
      auVar230 = ZEXT3264(local_620);
      auVar232 = ZEXT3264(local_7c0);
      auVar251 = ZEXT3264(local_800);
      auVar250 = ZEXT3264(local_700);
      auVar196 = ZEXT3264(local_560);
      auVar211 = ZEXT3264(local_680);
      auVar241 = ZEXT3264(local_720);
      auVar242 = ZEXT3264(local_820);
      auVar243 = ZEXT3264(local_840);
      auVar244 = ZEXT3264(local_740);
      auVar245 = ZEXT3264(local_760);
      auVar247 = ZEXT3264(local_860);
      auVar248 = ZEXT3264(local_880);
      auVar249 = ZEXT3264(local_780);
      auVar254 = ZEXT3264(local_8a0);
      auVar252 = ZEXT3264(local_7a0);
    }
    else {
      fVar217 = *(float *)(ray + k * 4 + 0x80) - (float)local_5c0._0_4_;
      auVar147._4_4_ = fVar217;
      auVar147._0_4_ = fVar217;
      auVar147._8_4_ = fVar217;
      auVar147._12_4_ = fVar217;
      auVar147._16_4_ = fVar217;
      auVar147._20_4_ = fVar217;
      auVar147._24_4_ = fVar217;
      auVar147._28_4_ = fVar217;
      auVar107 = vminps_avx512vl(auVar147,auVar115);
      auVar63._4_4_ = fStack_1fc;
      auVar63._0_4_ = local_200;
      auVar63._8_4_ = fStack_1f8;
      auVar63._12_4_ = fStack_1f4;
      auVar63._16_4_ = fStack_1f0;
      auVar63._20_4_ = fStack_1ec;
      auVar63._24_4_ = fStack_1e8;
      auVar63._28_4_ = fStack_1e4;
      auVar110 = vmaxps_avx512vl(auVar63,auVar114);
      auVar103 = vmulps_avx512vl(auVar103,auVar239);
      auVar102 = vfmadd213ps_avx512vl(auVar102,auVar236,auVar103);
      auVar101 = vfmadd213ps_avx512vl(auVar101,auVar41,auVar102);
      auVar102 = vmulps_avx512vl(local_3a0,auVar239);
      auVar102 = vfmadd231ps_avx512vl(auVar102,local_7e0,auVar236);
      auVar102 = vfmadd231ps_avx512vl(auVar102,local_380,auVar41);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar253 = ZEXT3264(auVar116);
      vandps_avx512vl(auVar102,auVar116);
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar16 = vcmpps_avx512vl(auVar116,auVar103,1);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar113);
      auVar101 = vxorps_avx512vl(auVar101,auVar113);
      auVar111 = vrcp14ps_avx512vl(auVar102);
      auVar112 = vxorps_avx512vl(auVar102,auVar113);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar118 = vfnmadd213ps_avx512vl(auVar111,auVar102,auVar117);
      auVar118 = vfmadd132ps_avx512vl(auVar118,auVar111,auVar111);
      auVar118 = vmulps_avx512vl(auVar118,auVar101);
      uVar17 = vcmpps_avx512vl(auVar102,auVar112,1);
      bVar72 = (byte)uVar16 | (byte)uVar17;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar101 = vblendmps_avx512vl(auVar118,auVar119);
      auVar120._0_4_ =
           (uint)(bVar72 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar111._0_4_;
      bVar75 = (bool)(bVar72 >> 1 & 1);
      auVar120._4_4_ = (uint)bVar75 * auVar101._4_4_ | (uint)!bVar75 * auVar111._4_4_;
      bVar75 = (bool)(bVar72 >> 2 & 1);
      auVar120._8_4_ = (uint)bVar75 * auVar101._8_4_ | (uint)!bVar75 * auVar111._8_4_;
      bVar75 = (bool)(bVar72 >> 3 & 1);
      auVar120._12_4_ = (uint)bVar75 * auVar101._12_4_ | (uint)!bVar75 * auVar111._12_4_;
      bVar75 = (bool)(bVar72 >> 4 & 1);
      auVar120._16_4_ = (uint)bVar75 * auVar101._16_4_ | (uint)!bVar75 * auVar111._16_4_;
      bVar75 = (bool)(bVar72 >> 5 & 1);
      auVar120._20_4_ = (uint)bVar75 * auVar101._20_4_ | (uint)!bVar75 * auVar111._20_4_;
      bVar75 = (bool)(bVar72 >> 6 & 1);
      auVar120._24_4_ = (uint)bVar75 * auVar101._24_4_ | (uint)!bVar75 * auVar111._24_4_;
      auVar120._28_4_ =
           (uint)(bVar72 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar72 >> 7) * auVar111._28_4_;
      auVar101 = vmaxps_avx(auVar110,auVar120);
      uVar17 = vcmpps_avx512vl(auVar102,auVar112,6);
      bVar72 = (byte)uVar16 | (byte)uVar17;
      auVar121._0_4_ = (uint)(bVar72 & 1) * 0x7f800000 | (uint)!(bool)(bVar72 & 1) * auVar118._0_4_;
      bVar75 = (bool)(bVar72 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * auVar118._4_4_;
      bVar75 = (bool)(bVar72 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * auVar118._8_4_;
      bVar75 = (bool)(bVar72 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * auVar118._12_4_;
      bVar75 = (bool)(bVar72 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * auVar118._16_4_;
      bVar75 = (bool)(bVar72 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * auVar118._20_4_;
      bVar75 = (bool)(bVar72 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * auVar118._24_4_;
      auVar121._28_4_ =
           (uint)(bVar72 >> 7) * 0x7f800000 | (uint)!(bool)(bVar72 >> 7) * auVar118._28_4_;
      auVar102 = vminps_avx(auVar107,auVar121);
      auVar81 = vxorps_avx512vl(auVar112._0_16_,auVar112._0_16_);
      auVar94 = vsubps_avx512vl(ZEXT1632(auVar81),auVar94);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar81),auVar97);
      auVar107 = ZEXT1632(auVar81);
      auVar98 = vsubps_avx512vl(auVar107,auVar98);
      auVar46._4_4_ = auVar98._4_4_ * auVar100._4_4_;
      auVar46._0_4_ = auVar98._0_4_ * auVar100._0_4_;
      auVar46._8_4_ = auVar98._8_4_ * auVar100._8_4_;
      auVar46._12_4_ = auVar98._12_4_ * auVar100._12_4_;
      auVar46._16_4_ = auVar98._16_4_ * auVar100._16_4_;
      auVar46._20_4_ = auVar98._20_4_ * auVar100._20_4_;
      auVar46._24_4_ = auVar98._24_4_ * auVar100._24_4_;
      auVar46._28_4_ = auVar98._28_4_;
      auVar97 = vfnmsub231ps_avx512vl(auVar46,auVar89,auVar97);
      auVar94 = vfnmadd231ps_avx512vl(auVar97,auVar88,auVar94);
      auVar97 = vmulps_avx512vl(local_3a0,auVar100);
      auVar97 = vfnmsub231ps_avx512vl(auVar97,local_7e0,auVar89);
      auVar97 = vfnmadd231ps_avx512vl(auVar97,local_380,auVar88);
      vandps_avx512vl(auVar97,auVar116);
      uVar16 = vcmpps_avx512vl(auVar97,auVar103,1);
      auVar94 = vxorps_avx512vl(auVar94,auVar113);
      auVar98 = vrcp14ps_avx512vl(auVar97);
      auVar88 = vxorps_avx512vl(auVar97,auVar113);
      auVar100 = vfnmadd213ps_avx512vl(auVar98,auVar97,auVar117);
      auVar81 = vfmadd132ps_fma(auVar100,auVar98,auVar98);
      fVar217 = auVar81._0_4_ * auVar94._0_4_;
      fVar224 = auVar81._4_4_ * auVar94._4_4_;
      auVar47._4_4_ = fVar224;
      auVar47._0_4_ = fVar217;
      fVar225 = auVar81._8_4_ * auVar94._8_4_;
      auVar47._8_4_ = fVar225;
      fVar226 = auVar81._12_4_ * auVar94._12_4_;
      auVar47._12_4_ = fVar226;
      fVar233 = auVar94._16_4_ * 0.0;
      auVar47._16_4_ = fVar233;
      fVar227 = auVar94._20_4_ * 0.0;
      auVar47._20_4_ = fVar227;
      fVar197 = auVar94._24_4_ * 0.0;
      auVar47._24_4_ = fVar197;
      auVar47._28_4_ = auVar94._28_4_;
      uVar17 = vcmpps_avx512vl(auVar97,auVar88,1);
      bVar72 = (byte)uVar16 | (byte)uVar17;
      auVar100 = vblendmps_avx512vl(auVar47,auVar119);
      auVar122._0_4_ =
           (uint)(bVar72 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar98._0_4_;
      bVar75 = (bool)(bVar72 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar75 * auVar100._4_4_ | (uint)!bVar75 * auVar98._4_4_;
      bVar75 = (bool)(bVar72 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar75 * auVar100._8_4_ | (uint)!bVar75 * auVar98._8_4_;
      bVar75 = (bool)(bVar72 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar75 * auVar100._12_4_ | (uint)!bVar75 * auVar98._12_4_;
      bVar75 = (bool)(bVar72 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar75 * auVar100._16_4_ | (uint)!bVar75 * auVar98._16_4_;
      bVar75 = (bool)(bVar72 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar75 * auVar100._20_4_ | (uint)!bVar75 * auVar98._20_4_;
      bVar75 = (bool)(bVar72 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar75 * auVar100._24_4_ | (uint)!bVar75 * auVar98._24_4_;
      auVar122._28_4_ =
           (uint)(bVar72 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar72 >> 7) * auVar98._28_4_;
      _local_4c0 = vmaxps_avx(auVar101,auVar122);
      uVar17 = vcmpps_avx512vl(auVar97,auVar88,6);
      bVar72 = (byte)uVar16 | (byte)uVar17;
      auVar123._0_4_ = (uint)(bVar72 & 1) * 0x7f800000 | (uint)!(bool)(bVar72 & 1) * (int)fVar217;
      bVar75 = (bool)(bVar72 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar224;
      bVar75 = (bool)(bVar72 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar225;
      bVar75 = (bool)(bVar72 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar226;
      bVar75 = (bool)(bVar72 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar233;
      bVar75 = (bool)(bVar72 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar227;
      bVar75 = (bool)(bVar72 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar197;
      auVar123._28_4_ =
           (uint)(bVar72 >> 7) * 0x7f800000 | (uint)!(bool)(bVar72 >> 7) * auVar94._28_4_;
      local_260 = vminps_avx(auVar102,auVar123);
      uVar16 = vcmpps_avx512vl(_local_4c0,local_260,2);
      bVar67 = bVar67 & 0x7f & (byte)uVar16;
      if (bVar67 == 0) goto LAB_01d77039;
      auVar97 = vmaxps_avx512vl(auVar107,auVar91);
      auVar91 = vminps_avx512vl(local_2e0,auVar117);
      auVar54 = ZEXT412(0);
      auVar94 = ZEXT1232(auVar54) << 0x20;
      auVar91 = vmaxps_avx(auVar91,ZEXT1232(auVar54) << 0x20);
      auVar98 = vminps_avx512vl(local_300,auVar117);
      auVar48._4_4_ = (auVar91._4_4_ + 1.0) * 0.125;
      auVar48._0_4_ = (auVar91._0_4_ + 0.0) * 0.125;
      auVar48._8_4_ = (auVar91._8_4_ + 2.0) * 0.125;
      auVar48._12_4_ = (auVar91._12_4_ + 3.0) * 0.125;
      auVar48._16_4_ = (auVar91._16_4_ + 4.0) * 0.125;
      auVar48._20_4_ = (auVar91._20_4_ + 5.0) * 0.125;
      auVar48._24_4_ = (auVar91._24_4_ + 6.0) * 0.125;
      auVar48._28_4_ = auVar91._28_4_ + 7.0;
      auVar81 = vfmadd213ps_fma(auVar48,local_660,auVar216);
      local_2e0 = ZEXT1632(auVar81);
      auVar91 = vmaxps_avx(auVar98,ZEXT1232(auVar54) << 0x20);
      auVar49._4_4_ = (auVar91._4_4_ + 1.0) * 0.125;
      auVar49._0_4_ = (auVar91._0_4_ + 0.0) * 0.125;
      auVar49._8_4_ = (auVar91._8_4_ + 2.0) * 0.125;
      auVar49._12_4_ = (auVar91._12_4_ + 3.0) * 0.125;
      auVar49._16_4_ = (auVar91._16_4_ + 4.0) * 0.125;
      auVar49._20_4_ = (auVar91._20_4_ + 5.0) * 0.125;
      auVar49._24_4_ = (auVar91._24_4_ + 6.0) * 0.125;
      auVar49._28_4_ = auVar91._28_4_ + 7.0;
      auVar81 = vfmadd213ps_fma(auVar49,local_660,auVar216);
      local_300 = ZEXT1632(auVar81);
      auVar148._0_4_ = auVar97._0_4_ * auVar97._0_4_;
      auVar148._4_4_ = auVar97._4_4_ * auVar97._4_4_;
      auVar148._8_4_ = auVar97._8_4_ * auVar97._8_4_;
      auVar148._12_4_ = auVar97._12_4_ * auVar97._12_4_;
      auVar148._16_4_ = auVar97._16_4_ * auVar97._16_4_;
      auVar148._20_4_ = auVar97._20_4_ * auVar97._20_4_;
      auVar148._24_4_ = auVar97._24_4_ * auVar97._24_4_;
      auVar148._28_4_ = 0;
      auVar91 = vsubps_avx(auVar105,auVar148);
      auVar97 = vmulps_avx512vl(auVar109,auVar91);
      auVar97 = vsubps_avx512vl(auVar108,auVar97);
      uVar16 = vcmpps_avx512vl(auVar97,ZEXT1232(auVar54) << 0x20,5);
      bVar72 = (byte)uVar16;
      auVar241 = ZEXT3264(local_720);
      auVar249 = ZEXT3264(local_780);
      auVar252 = ZEXT3264(local_7a0);
      if (bVar72 == 0) {
        auVar90 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar92 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar98 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar231 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar124._8_4_ = 0x7f800000;
        auVar124._0_8_ = 0x7f8000007f800000;
        auVar124._12_4_ = 0x7f800000;
        auVar124._16_4_ = 0x7f800000;
        auVar124._20_4_ = 0x7f800000;
        auVar124._24_4_ = 0x7f800000;
        auVar124._28_4_ = 0x7f800000;
        auVar125._8_4_ = 0xff800000;
        auVar125._0_8_ = 0xff800000ff800000;
        auVar125._12_4_ = 0xff800000;
        auVar125._16_4_ = 0xff800000;
        auVar125._20_4_ = 0xff800000;
        auVar125._24_4_ = 0xff800000;
        auVar125._28_4_ = 0xff800000;
      }
      else {
        auVar82 = vxorps_avx512vl(auVar89._0_16_,auVar89._0_16_);
        uVar78 = vcmpps_avx512vl(auVar97,auVar107,5);
        auVar94 = vsqrtps_avx(auVar97);
        auVar171._0_4_ = auVar86._0_4_ + auVar86._0_4_;
        auVar171._4_4_ = auVar86._4_4_ + auVar86._4_4_;
        auVar171._8_4_ = auVar86._8_4_ + auVar86._8_4_;
        auVar171._12_4_ = auVar86._12_4_ + auVar86._12_4_;
        auVar171._16_4_ = auVar86._16_4_ + auVar86._16_4_;
        auVar171._20_4_ = auVar86._20_4_ + auVar86._20_4_;
        auVar171._24_4_ = auVar86._24_4_ + auVar86._24_4_;
        auVar171._28_4_ = auVar86._28_4_ + auVar86._28_4_;
        auVar97 = vrcp14ps_avx512vl(auVar171);
        auVar98 = vfnmadd213ps_avx512vl(auVar171,auVar97,auVar117);
        auVar81 = vfmadd132ps_fma(auVar98,auVar97,auVar97);
        auVar28._8_4_ = 0x80000000;
        auVar28._0_8_ = 0x8000000080000000;
        auVar28._12_4_ = 0x80000000;
        auVar28._16_4_ = 0x80000000;
        auVar28._20_4_ = 0x80000000;
        auVar28._24_4_ = 0x80000000;
        auVar28._28_4_ = 0x80000000;
        auVar97 = vxorps_avx512vl(auVar104,auVar28);
        auVar97 = vsubps_avx(auVar97,auVar94);
        auVar50._4_4_ = auVar97._4_4_ * auVar81._4_4_;
        auVar50._0_4_ = auVar97._0_4_ * auVar81._0_4_;
        auVar50._8_4_ = auVar97._8_4_ * auVar81._8_4_;
        auVar50._12_4_ = auVar97._12_4_ * auVar81._12_4_;
        auVar50._16_4_ = auVar97._16_4_ * 0.0;
        auVar50._20_4_ = auVar97._20_4_ * 0.0;
        auVar50._24_4_ = auVar97._24_4_ * 0.0;
        auVar50._28_4_ = 0x3e000000;
        auVar94 = vsubps_avx512vl(auVar94,auVar104);
        auVar51._4_4_ = auVar94._4_4_ * auVar81._4_4_;
        auVar51._0_4_ = auVar94._0_4_ * auVar81._0_4_;
        auVar51._8_4_ = auVar94._8_4_ * auVar81._8_4_;
        auVar51._12_4_ = auVar94._12_4_ * auVar81._12_4_;
        auVar51._16_4_ = auVar94._16_4_ * 0.0;
        auVar51._20_4_ = auVar94._20_4_ * 0.0;
        auVar51._24_4_ = auVar94._24_4_ * 0.0;
        auVar51._28_4_ = fVar137;
        auVar94 = vfmadd213ps_avx512vl(auVar106,auVar50,auVar90);
        auVar52._4_4_ = auVar99._4_4_ * auVar94._4_4_;
        auVar52._0_4_ = auVar99._0_4_ * auVar94._0_4_;
        auVar52._8_4_ = auVar99._8_4_ * auVar94._8_4_;
        auVar52._12_4_ = auVar99._12_4_ * auVar94._12_4_;
        auVar52._16_4_ = auVar99._16_4_ * auVar94._16_4_;
        auVar52._20_4_ = auVar99._20_4_ * auVar94._20_4_;
        auVar52._24_4_ = auVar99._24_4_ * auVar94._24_4_;
        auVar52._28_4_ = auVar97._28_4_;
        auVar94 = vmulps_avx512vl(local_380,auVar50);
        auVar98 = vmulps_avx512vl(local_7e0,auVar50);
        auVar88 = vmulps_avx512vl(local_3a0,auVar50);
        auVar97 = vfmadd213ps_avx512vl(auVar92,auVar52,auVar95);
        auVar97 = vsubps_avx512vl(auVar94,auVar97);
        auVar94 = vfmadd213ps_avx512vl(auVar93,auVar52,auVar96);
        auVar98 = vsubps_avx512vl(auVar98,auVar94);
        auVar81 = vfmadd213ps_fma(auVar52,auVar87,local_600);
        auVar94 = vsubps_avx(auVar88,ZEXT1632(auVar81));
        auVar231 = auVar94._0_28_;
        auVar90 = vfmadd213ps_avx512vl(auVar106,auVar51,auVar90);
        auVar99 = vmulps_avx512vl(auVar99,auVar90);
        auVar90 = vmulps_avx512vl(local_380,auVar51);
        auVar88 = vmulps_avx512vl(local_7e0,auVar51);
        auVar89 = vmulps_avx512vl(local_3a0,auVar51);
        auVar81 = vfmadd213ps_fma(auVar92,auVar99,auVar95);
        auVar94 = vsubps_avx(auVar90,ZEXT1632(auVar81));
        auVar81 = vfmadd213ps_fma(auVar93,auVar99,auVar96);
        auVar90 = vsubps_avx512vl(auVar88,ZEXT1632(auVar81));
        auVar81 = vfmadd213ps_fma(auVar87,auVar99,local_600);
        auVar92 = vsubps_avx512vl(auVar89,ZEXT1632(auVar81));
        auVar192._8_4_ = 0x7f800000;
        auVar192._0_8_ = 0x7f8000007f800000;
        auVar192._12_4_ = 0x7f800000;
        auVar192._16_4_ = 0x7f800000;
        auVar192._20_4_ = 0x7f800000;
        auVar192._24_4_ = 0x7f800000;
        auVar192._28_4_ = 0x7f800000;
        auVar93 = vblendmps_avx512vl(auVar192,auVar50);
        bVar75 = (bool)((byte)uVar78 & 1);
        auVar124._0_4_ = (uint)bVar75 * auVar93._0_4_ | (uint)!bVar75 * auVar95._0_4_;
        bVar75 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar75 * auVar93._4_4_ | (uint)!bVar75 * auVar95._4_4_;
        bVar75 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar75 * auVar93._8_4_ | (uint)!bVar75 * auVar95._8_4_;
        bVar75 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar75 * auVar93._12_4_ | (uint)!bVar75 * auVar95._12_4_;
        bVar75 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar124._16_4_ = (uint)bVar75 * auVar93._16_4_ | (uint)!bVar75 * auVar95._16_4_;
        bVar75 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar124._20_4_ = (uint)bVar75 * auVar93._20_4_ | (uint)!bVar75 * auVar95._20_4_;
        bVar75 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar124._24_4_ = (uint)bVar75 * auVar93._24_4_ | (uint)!bVar75 * auVar95._24_4_;
        bVar75 = SUB81(uVar78 >> 7,0);
        auVar124._28_4_ = (uint)bVar75 * auVar93._28_4_ | (uint)!bVar75 * auVar95._28_4_;
        auVar193._8_4_ = 0xff800000;
        auVar193._0_8_ = 0xff800000ff800000;
        auVar193._12_4_ = 0xff800000;
        auVar193._16_4_ = 0xff800000;
        auVar193._20_4_ = 0xff800000;
        auVar193._24_4_ = 0xff800000;
        auVar193._28_4_ = 0xff800000;
        auVar93 = vblendmps_avx512vl(auVar193,auVar51);
        bVar75 = (bool)((byte)uVar78 & 1);
        auVar125._0_4_ = (uint)bVar75 * auVar93._0_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar75 * auVar93._4_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar75 * auVar93._8_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar75 * auVar93._12_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar125._16_4_ = (uint)bVar75 * auVar93._16_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar125._20_4_ = (uint)bVar75 * auVar93._20_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar125._24_4_ = (uint)bVar75 * auVar93._24_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = SUB81(uVar78 >> 7,0);
        auVar125._28_4_ = (uint)bVar75 * auVar93._28_4_ | (uint)!bVar75 * -0x800000;
        vandps_avx512vl(auVar116,local_4a0);
        auVar93 = vmaxps_avx(local_2a0,auVar125);
        auVar29._8_4_ = 0x36000000;
        auVar29._0_8_ = 0x3600000036000000;
        auVar29._12_4_ = 0x36000000;
        auVar29._16_4_ = 0x36000000;
        auVar29._20_4_ = 0x36000000;
        auVar29._24_4_ = 0x36000000;
        auVar29._28_4_ = 0x36000000;
        auVar93 = vmulps_avx512vl(auVar93,auVar29);
        vandps_avx512vl(auVar86,auVar116);
        uVar68 = vcmpps_avx512vl(auVar93,auVar93,1);
        uVar78 = uVar78 & uVar68;
        bVar66 = (byte)uVar78;
        if (bVar66 != 0) {
          uVar68 = vcmpps_avx512vl(auVar91,ZEXT1632(auVar82),2);
          auVar229._8_4_ = 0xff800000;
          auVar229._0_8_ = 0xff800000ff800000;
          auVar229._12_4_ = 0xff800000;
          auVar229._16_4_ = 0xff800000;
          auVar229._20_4_ = 0xff800000;
          auVar229._24_4_ = 0xff800000;
          auVar229._28_4_ = 0xff800000;
          auVar234._8_4_ = 0x7f800000;
          auVar234._0_8_ = 0x7f8000007f800000;
          auVar234._12_4_ = 0x7f800000;
          auVar234._16_4_ = 0x7f800000;
          auVar234._20_4_ = 0x7f800000;
          auVar234._24_4_ = 0x7f800000;
          auVar234._28_4_ = 0x7f800000;
          auVar91 = vblendmps_avx512vl(auVar234,auVar229);
          bVar64 = (byte)uVar68;
          uVar69 = (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar93._0_4_;
          bVar75 = (bool)((byte)(uVar68 >> 1) & 1);
          uVar129 = (uint)bVar75 * auVar91._4_4_ | (uint)!bVar75 * auVar93._4_4_;
          bVar75 = (bool)((byte)(uVar68 >> 2) & 1);
          uVar130 = (uint)bVar75 * auVar91._8_4_ | (uint)!bVar75 * auVar93._8_4_;
          bVar75 = (bool)((byte)(uVar68 >> 3) & 1);
          uVar131 = (uint)bVar75 * auVar91._12_4_ | (uint)!bVar75 * auVar93._12_4_;
          bVar75 = (bool)((byte)(uVar68 >> 4) & 1);
          uVar132 = (uint)bVar75 * auVar91._16_4_ | (uint)!bVar75 * auVar93._16_4_;
          bVar75 = (bool)((byte)(uVar68 >> 5) & 1);
          uVar133 = (uint)bVar75 * auVar91._20_4_ | (uint)!bVar75 * auVar93._20_4_;
          bVar75 = (bool)((byte)(uVar68 >> 6) & 1);
          uVar134 = (uint)bVar75 * auVar91._24_4_ | (uint)!bVar75 * auVar93._24_4_;
          bVar75 = SUB81(uVar68 >> 7,0);
          uVar135 = (uint)bVar75 * auVar91._28_4_ | (uint)!bVar75 * auVar93._28_4_;
          auVar124._0_4_ = (bVar66 & 1) * uVar69 | !(bool)(bVar66 & 1) * auVar124._0_4_;
          bVar75 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar124._4_4_ = bVar75 * uVar129 | !bVar75 * auVar124._4_4_;
          bVar75 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar124._8_4_ = bVar75 * uVar130 | !bVar75 * auVar124._8_4_;
          bVar75 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar124._12_4_ = bVar75 * uVar131 | !bVar75 * auVar124._12_4_;
          bVar75 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar124._16_4_ = bVar75 * uVar132 | !bVar75 * auVar124._16_4_;
          bVar75 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar124._20_4_ = bVar75 * uVar133 | !bVar75 * auVar124._20_4_;
          bVar75 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar124._24_4_ = bVar75 * uVar134 | !bVar75 * auVar124._24_4_;
          bVar75 = SUB81(uVar78 >> 7,0);
          auVar124._28_4_ = bVar75 * uVar135 | !bVar75 * auVar124._28_4_;
          auVar91 = vblendmps_avx512vl(auVar229,auVar234);
          bVar75 = (bool)((byte)(uVar68 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar68 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar68 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar68 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar68 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar68 >> 6) & 1);
          bVar13 = SUB81(uVar68 >> 7,0);
          auVar125._0_4_ =
               (uint)(bVar66 & 1) *
               ((uint)(bVar64 & 1) * auVar91._0_4_ | !(bool)(bVar64 & 1) * uVar69) |
               !(bool)(bVar66 & 1) * auVar125._0_4_;
          bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar125._4_4_ =
               (uint)bVar7 * ((uint)bVar75 * auVar91._4_4_ | !bVar75 * uVar129) |
               !bVar7 * auVar125._4_4_;
          bVar75 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar125._8_4_ =
               (uint)bVar75 * ((uint)bVar8 * auVar91._8_4_ | !bVar8 * uVar130) |
               !bVar75 * auVar125._8_4_;
          bVar75 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar125._12_4_ =
               (uint)bVar75 * ((uint)bVar9 * auVar91._12_4_ | !bVar9 * uVar131) |
               !bVar75 * auVar125._12_4_;
          bVar75 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar125._16_4_ =
               (uint)bVar75 * ((uint)bVar10 * auVar91._16_4_ | !bVar10 * uVar132) |
               !bVar75 * auVar125._16_4_;
          bVar75 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar125._20_4_ =
               (uint)bVar75 * ((uint)bVar11 * auVar91._20_4_ | !bVar11 * uVar133) |
               !bVar75 * auVar125._20_4_;
          bVar75 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar125._24_4_ =
               (uint)bVar75 * ((uint)bVar12 * auVar91._24_4_ | !bVar12 * uVar134) |
               !bVar75 * auVar125._24_4_;
          bVar75 = SUB81(uVar78 >> 7,0);
          auVar125._28_4_ =
               (uint)bVar75 * ((uint)bVar13 * auVar91._28_4_ | !bVar13 * uVar135) |
               !bVar75 * auVar125._28_4_;
          bVar72 = (~bVar66 | bVar64) & bVar72;
        }
      }
      auVar254 = ZEXT3264(local_8a0);
      auVar251 = ZEXT3264(local_800);
      auVar248 = ZEXT3264(local_880);
      auVar247 = ZEXT3264(local_860);
      auVar246 = ZEXT3264(local_7e0);
      auVar243 = ZEXT3264(local_840);
      auVar242 = ZEXT3264(local_820);
      auVar91 = vmulps_avx512vl(local_3a0,auVar92);
      auVar91 = vfmadd231ps_avx512vl(auVar91,local_7e0,auVar90);
      auVar81 = vfmadd231ps_fma(auVar91,local_380,auVar94);
      _local_1c0 = _local_4c0;
      local_1a0 = vminps_avx(local_260,auVar124);
      vandps_avx512vl(ZEXT1632(auVar81),auVar116);
      _local_280 = vmaxps_avx(_local_4c0,auVar125);
      auVar194._8_4_ = 0x3e99999a;
      auVar194._0_8_ = 0x3e99999a3e99999a;
      auVar194._12_4_ = 0x3e99999a;
      auVar194._16_4_ = 0x3e99999a;
      auVar194._20_4_ = 0x3e99999a;
      auVar194._24_4_ = 0x3e99999a;
      auVar194._28_4_ = 0x3e99999a;
      uVar16 = vcmpps_avx512vl(auVar91,auVar194,1);
      local_8ac = (undefined4)uVar16;
      uVar16 = vcmpps_avx512vl(_local_4c0,local_1a0,2);
      bVar66 = (byte)uVar16 & bVar67;
      _local_340 = _local_280;
      uVar17 = vcmpps_avx512vl(_local_280,local_260,2);
      auVar250 = ZEXT3264(local_700);
      auVar244 = ZEXT3264(local_740);
      auVar245 = ZEXT3264(local_760);
      if ((bVar67 & ((byte)uVar17 | (byte)uVar16)) == 0) {
        auVar204 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar230 = ZEXT3264(local_620);
        auVar232 = ZEXT3264(local_7c0);
        auVar196 = ZEXT3264(local_560);
        auVar211 = ZEXT3264(local_680);
      }
      else {
        auVar53._4_4_ = auVar231._4_4_ * local_3a0._4_4_;
        auVar53._0_4_ = auVar231._0_4_ * local_3a0._0_4_;
        auVar53._8_4_ = auVar231._8_4_ * local_3a0._8_4_;
        auVar53._12_4_ = auVar231._12_4_ * local_3a0._12_4_;
        auVar53._16_4_ = auVar231._16_4_ * local_3a0._16_4_;
        auVar53._20_4_ = auVar231._20_4_ * local_3a0._20_4_;
        auVar53._24_4_ = auVar231._24_4_ * local_3a0._24_4_;
        auVar53._28_4_ = 0x3e99999a;
        auVar91 = vfmadd213ps_avx512vl(auVar98,local_7e0,auVar53);
        auVar81 = vfmadd213ps_fma(auVar97,local_380,auVar91);
        vandps_avx512vl(ZEXT1632(auVar81),auVar116);
        uVar16 = vcmpps_avx512vl(auVar91,auVar194,1);
        local_8b4 = (uint)(byte)~bVar72;
        bVar72 = (byte)uVar16 | ~bVar72;
        auVar149._8_4_ = 2;
        auVar149._0_8_ = 0x200000002;
        auVar149._12_4_ = 2;
        auVar149._16_4_ = 2;
        auVar149._20_4_ = 2;
        auVar149._24_4_ = 2;
        auVar149._28_4_ = 2;
        auVar30._8_4_ = 3;
        auVar30._0_8_ = 0x300000003;
        auVar30._12_4_ = 3;
        auVar30._16_4_ = 3;
        auVar30._20_4_ = 3;
        auVar30._24_4_ = 3;
        auVar30._28_4_ = 3;
        auVar91 = vpblendmd_avx512vl(auVar149,auVar30);
        local_240._0_4_ = (uint)(bVar72 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar72 & 1) * 2;
        bVar75 = (bool)(bVar72 >> 1 & 1);
        local_240._4_4_ = (uint)bVar75 * auVar91._4_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar72 >> 2 & 1);
        local_240._8_4_ = (uint)bVar75 * auVar91._8_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar72 >> 3 & 1);
        local_240._12_4_ = (uint)bVar75 * auVar91._12_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar72 >> 4 & 1);
        local_240._16_4_ = (uint)bVar75 * auVar91._16_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar72 >> 5 & 1);
        local_240._20_4_ = (uint)bVar75 * auVar91._20_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar72 >> 6 & 1);
        local_240._24_4_ = (uint)bVar75 * auVar91._24_4_ | (uint)!bVar75 * 2;
        local_240._28_4_ = (uint)(bVar72 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar72 >> 7) * 2;
        local_2c0 = vpbroadcastd_avx512vl();
        uVar16 = vpcmpd_avx512vl(local_2c0,local_240,5);
        local_8b0 = (uint)bVar66;
        bVar66 = (byte)uVar16 & bVar66;
        if (bVar66 == 0) {
          auVar207._8_4_ = 0x7fffffff;
          auVar207._0_8_ = 0x7fffffff7fffffff;
          auVar207._12_4_ = 0x7fffffff;
          auVar232 = ZEXT3264(local_7c0);
        }
        else {
          auVar82 = vminps_avx(local_4e0._0_16_,local_520._0_16_);
          auVar81 = vmaxps_avx(local_4e0._0_16_,local_520._0_16_);
          auVar79 = vminps_avx(local_500._0_16_,local_540._0_16_);
          auVar83 = vminps_avx(auVar82,auVar79);
          auVar82 = vmaxps_avx(local_500._0_16_,local_540._0_16_);
          auVar79 = vmaxps_avx(auVar81,auVar82);
          auVar177._8_4_ = 0x7fffffff;
          auVar177._0_8_ = 0x7fffffff7fffffff;
          auVar177._12_4_ = 0x7fffffff;
          auVar81 = vandps_avx(auVar83,auVar177);
          auVar82 = vandps_avx(auVar79,auVar177);
          auVar81 = vmaxps_avx(auVar81,auVar82);
          auVar82 = vmovshdup_avx(auVar81);
          auVar82 = vmaxss_avx(auVar82,auVar81);
          auVar81 = vshufpd_avx(auVar81,auVar81,1);
          auVar81 = vmaxss_avx(auVar81,auVar82);
          fVar217 = auVar81._0_4_ * 1.9073486e-06;
          local_5d0 = vshufps_avx(auVar79,auVar79,0xff);
          local_320 = (float)local_4c0._0_4_ + (float)local_360._0_4_;
          fStack_31c = (float)local_4c0._4_4_ + (float)local_360._4_4_;
          fStack_318 = fStack_4b8 + fStack_358;
          fStack_314 = fStack_4b4 + fStack_354;
          fStack_310 = fStack_4b0 + fStack_350;
          fStack_30c = fStack_4ac + fStack_34c;
          fStack_308 = fStack_4a8 + fStack_348;
          fStack_304 = fStack_4a4 + fStack_344;
          do {
            auVar150._8_4_ = 0x7f800000;
            auVar150._0_8_ = 0x7f8000007f800000;
            auVar150._12_4_ = 0x7f800000;
            auVar150._16_4_ = 0x7f800000;
            auVar150._20_4_ = 0x7f800000;
            auVar150._24_4_ = 0x7f800000;
            auVar150._28_4_ = 0x7f800000;
            auVar91 = vblendmps_avx512vl(auVar150,_local_4c0);
            auVar126._0_4_ =
                 (uint)(bVar66 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar66 & 1) * 0x7f800000;
            bVar75 = (bool)(bVar66 >> 1 & 1);
            auVar126._4_4_ = (uint)bVar75 * auVar91._4_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar66 >> 2 & 1);
            auVar126._8_4_ = (uint)bVar75 * auVar91._8_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar66 >> 3 & 1);
            auVar126._12_4_ = (uint)bVar75 * auVar91._12_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar66 >> 4 & 1);
            auVar126._16_4_ = (uint)bVar75 * auVar91._16_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar66 >> 5 & 1);
            auVar126._20_4_ = (uint)bVar75 * auVar91._20_4_ | (uint)!bVar75 * 0x7f800000;
            auVar126._24_4_ =
                 (uint)(bVar66 >> 6) * auVar91._24_4_ | (uint)!(bool)(bVar66 >> 6) * 0x7f800000;
            auVar126._28_4_ = 0x7f800000;
            auVar91 = vshufps_avx(auVar126,auVar126,0xb1);
            auVar91 = vminps_avx(auVar126,auVar91);
            auVar90 = vshufpd_avx(auVar91,auVar91,5);
            auVar91 = vminps_avx(auVar91,auVar90);
            auVar90 = vpermpd_avx2(auVar91,0x4e);
            auVar91 = vminps_avx(auVar91,auVar90);
            uVar16 = vcmpps_avx512vl(auVar126,auVar91,0);
            bVar64 = (byte)uVar16 & bVar66;
            bVar72 = bVar66;
            if (bVar64 != 0) {
              bVar72 = bVar64;
            }
            iVar19 = 0;
            for (uVar69 = (uint)bVar72; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            bVar72 = '\x01' << ((byte)iVar19 & 0x1f);
            fVar224 = *(float *)(local_2e0 + (uint)(iVar19 << 2));
            fVar225 = *(float *)(local_1c0 + (uint)(iVar19 << 2));
            fVar226 = local_8a8;
            if ((float)local_640._0_4_ < 0.0) {
              fVar226 = sqrtf((float)local_640._0_4_);
            }
            bVar64 = ~bVar72;
            lVar73 = 5;
            do {
              auVar138._4_4_ = fVar225;
              auVar138._0_4_ = fVar225;
              auVar138._8_4_ = fVar225;
              auVar138._12_4_ = fVar225;
              auVar82 = vfmadd132ps_fma(auVar138,ZEXT816(0) << 0x40,local_630);
              fVar233 = 1.0 - fVar224;
              auVar178._0_4_ = local_520._0_4_ * fVar224;
              auVar178._4_4_ = local_520._4_4_ * fVar224;
              auVar178._8_4_ = local_520._8_4_ * fVar224;
              auVar178._12_4_ = local_520._12_4_ * fVar224;
              local_570 = ZEXT416((uint)fVar233);
              auVar199._4_4_ = fVar233;
              auVar199._0_4_ = fVar233;
              auVar199._8_4_ = fVar233;
              auVar199._12_4_ = fVar233;
              auVar81 = vfmadd231ps_fma(auVar178,auVar199,local_4e0._0_16_);
              auVar205._0_4_ = local_500._0_4_ * fVar224;
              auVar205._4_4_ = local_500._4_4_ * fVar224;
              auVar205._8_4_ = local_500._8_4_ * fVar224;
              auVar205._12_4_ = local_500._12_4_ * fVar224;
              auVar79 = vfmadd231ps_fma(auVar205,auVar199,local_520._0_16_);
              auVar214._0_4_ = fVar224 * (float)local_540._0_4_;
              auVar214._4_4_ = fVar224 * (float)local_540._4_4_;
              auVar214._8_4_ = fVar224 * fStack_538;
              auVar214._12_4_ = fVar224 * fStack_534;
              auVar83 = vfmadd231ps_fma(auVar214,auVar199,local_500._0_16_);
              auVar220._0_4_ = fVar224 * auVar79._0_4_;
              auVar220._4_4_ = fVar224 * auVar79._4_4_;
              auVar220._8_4_ = fVar224 * auVar79._8_4_;
              auVar220._12_4_ = fVar224 * auVar79._12_4_;
              auVar81 = vfmadd231ps_fma(auVar220,auVar199,auVar81);
              auVar179._0_4_ = fVar224 * auVar83._0_4_;
              auVar179._4_4_ = fVar224 * auVar83._4_4_;
              auVar179._8_4_ = fVar224 * auVar83._8_4_;
              auVar179._12_4_ = fVar224 * auVar83._12_4_;
              auVar79 = vfmadd231ps_fma(auVar179,auVar199,auVar79);
              auVar206._0_4_ = fVar224 * auVar79._0_4_;
              auVar206._4_4_ = fVar224 * auVar79._4_4_;
              auVar206._8_4_ = fVar224 * auVar79._8_4_;
              auVar206._12_4_ = fVar224 * auVar79._12_4_;
              auVar83 = vfmadd231ps_fma(auVar206,auVar81,auVar199);
              auVar81 = vsubps_avx(auVar79,auVar81);
              auVar20._8_4_ = 0x40400000;
              auVar20._0_8_ = 0x4040000040400000;
              auVar20._12_4_ = 0x40400000;
              auVar79 = vmulps_avx512vl(auVar81,auVar20);
              local_4a0._0_16_ = auVar83;
              auVar81 = vsubps_avx(auVar82,auVar83);
              local_660._0_16_ = auVar81;
              auVar81 = vdpps_avx(auVar81,auVar81,0x7f);
              local_600._0_16_ = auVar81;
              local_920 = ZEXT416((uint)fVar224);
              if (auVar81._0_4_ < 0.0) {
                auVar196._0_4_ = sqrtf(auVar81._0_4_);
                auVar196._4_60_ = extraout_var;
                auVar81 = auVar196._0_16_;
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
              }
              local_580 = vdpps_avx(auVar79,auVar79,0x7f);
              fVar233 = local_580._0_4_;
              auVar180._4_12_ = ZEXT812(0) << 0x20;
              auVar180._0_4_ = fVar233;
              auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar180);
              fVar137 = auVar82._0_4_;
              local_590 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar180);
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar83 = vxorps_avx512vl(local_580,auVar21);
              auVar82 = vfnmadd213ss_fma(local_590,local_580,ZEXT416(0x40000000));
              uVar69 = auVar81._0_4_;
              if (fVar233 < auVar83._0_4_) {
                auVar204._0_4_ = sqrtf(fVar233);
                auVar204._4_60_ = extraout_var_00;
                auVar81 = ZEXT416(uVar69);
                auVar83 = auVar204._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx512f(local_580,local_580);
              }
              fVar233 = fVar137 * 1.5 + fVar233 * -0.5 * fVar137 * fVar137 * fVar137;
              local_5a0._0_4_ = auVar79._0_4_ * fVar233;
              local_5a0._4_4_ = auVar79._4_4_ * fVar233;
              local_5a0._8_4_ = auVar79._8_4_ * fVar233;
              local_5a0._12_4_ = auVar79._12_4_ * fVar233;
              auVar1 = vdpps_avx(local_660._0_16_,local_5a0,0x7f);
              auVar84 = vaddss_avx512f(auVar81,ZEXT416(0x3f800000));
              auVar139._0_4_ = auVar1._0_4_ * auVar1._0_4_;
              auVar139._4_4_ = auVar1._4_4_ * auVar1._4_4_;
              auVar139._8_4_ = auVar1._8_4_ * auVar1._8_4_;
              auVar139._12_4_ = auVar1._12_4_ * auVar1._12_4_;
              auVar2 = vsubps_avx(local_600._0_16_,auVar139);
              fVar137 = auVar2._0_4_;
              auVar156._4_12_ = ZEXT812(0) << 0x20;
              auVar156._0_4_ = fVar137;
              auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar156);
              fVar227 = auVar80._0_4_;
              uVar76 = fVar137 == 0.0;
              uVar74 = fVar137 < 0.0;
              if ((bool)uVar74) {
                local_5b0 = fVar233;
                fStack_5ac = fVar233;
                fStack_5a8 = fVar233;
                fStack_5a4 = fVar233;
                fVar197 = sqrtf(fVar137);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar81 = ZEXT416(uVar69);
                auVar84 = ZEXT416(auVar84._0_4_);
                fVar233 = local_5b0;
                fVar228 = fStack_5ac;
                fVar237 = fStack_5a8;
                fVar238 = fStack_5a4;
              }
              else {
                auVar2 = vsqrtss_avx(auVar2,auVar2);
                fVar197 = auVar2._0_4_;
                fVar228 = fVar233;
                fVar237 = fVar233;
                fVar238 = fVar233;
              }
              auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar246 = ZEXT3264(local_7e0);
              auVar232 = ZEXT3264(local_7c0);
              auVar250 = ZEXT3264(local_700);
              auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920,local_570);
              fVar155 = auVar2._0_4_ * 6.0;
              fVar15 = fVar224 * 6.0;
              auVar181._0_4_ = fVar15 * (float)local_540._0_4_;
              auVar181._4_4_ = fVar15 * (float)local_540._4_4_;
              auVar181._8_4_ = fVar15 * fStack_538;
              auVar181._12_4_ = fVar15 * fStack_534;
              auVar157._4_4_ = fVar155;
              auVar157._0_4_ = fVar155;
              auVar157._8_4_ = fVar155;
              auVar157._12_4_ = fVar155;
              auVar2 = vfmadd132ps_fma(auVar157,auVar181,local_500._0_16_);
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_570,local_920);
              fVar155 = auVar80._0_4_ * 6.0;
              auVar182._4_4_ = fVar155;
              auVar182._0_4_ = fVar155;
              auVar182._8_4_ = fVar155;
              auVar182._12_4_ = fVar155;
              auVar2 = vfmadd132ps_fma(auVar182,auVar2,local_520._0_16_);
              fVar155 = local_570._0_4_ * 6.0;
              auVar158._4_4_ = fVar155;
              auVar158._0_4_ = fVar155;
              auVar158._8_4_ = fVar155;
              auVar158._12_4_ = fVar155;
              auVar2 = vfmadd132ps_fma(auVar158,auVar2,local_4e0._0_16_);
              auVar183._0_4_ = auVar2._0_4_ * (float)local_580._0_4_;
              auVar183._4_4_ = auVar2._4_4_ * (float)local_580._0_4_;
              auVar183._8_4_ = auVar2._8_4_ * (float)local_580._0_4_;
              auVar183._12_4_ = auVar2._12_4_ * (float)local_580._0_4_;
              auVar2 = vdpps_avx(auVar79,auVar2,0x7f);
              fVar155 = auVar2._0_4_;
              auVar159._0_4_ = auVar79._0_4_ * fVar155;
              auVar159._4_4_ = auVar79._4_4_ * fVar155;
              auVar159._8_4_ = auVar79._8_4_ * fVar155;
              auVar159._12_4_ = auVar79._12_4_ * fVar155;
              auVar80 = vsubps_avx(auVar183,auVar159);
              fVar155 = auVar82._0_4_ * (float)local_590._0_4_;
              auVar2 = vmaxss_avx(ZEXT416((uint)fVar217),
                                  ZEXT416((uint)(fVar225 * fVar226 * 1.9073486e-06)));
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar85 = vxorps_avx512vl(auVar79,auVar22);
              auVar184._0_4_ = fVar233 * auVar80._0_4_ * fVar155;
              auVar184._4_4_ = fVar228 * auVar80._4_4_ * fVar155;
              auVar184._8_4_ = fVar237 * auVar80._8_4_ * fVar155;
              auVar184._12_4_ = fVar238 * auVar80._12_4_ * fVar155;
              auVar82 = vdpps_avx(auVar85,local_5a0,0x7f);
              auVar80 = vdivss_avx512f(ZEXT416((uint)fVar217),auVar83);
              auVar83 = vfmadd213ss_fma(auVar81,ZEXT416((uint)fVar217),auVar2);
              auVar81 = vdpps_avx(local_660._0_16_,auVar184,0x7f);
              vfmadd213ss_avx512f(auVar84,auVar80,auVar83);
              fVar233 = auVar82._0_4_ + auVar81._0_4_;
              auVar81 = vdpps_avx(local_630,local_5a0,0x7f);
              auVar82 = vdpps_avx(local_660._0_16_,auVar85,0x7f);
              fVar137 = fVar227 * fVar137 * -0.5 * fVar227 * fVar227 + fVar227 * 1.5;
              auVar83 = vdpps_avx(local_660._0_16_,local_630,0x7f);
              in_ZMM31 = ZEXT1664(auVar1);
              auVar84 = vfnmadd231ss_avx512f(auVar82,auVar1,ZEXT416((uint)fVar233));
              auVar80 = vfnmadd231ss_avx512f(auVar83,auVar1,auVar81);
              auVar82 = vpermilps_avx(local_4a0._0_16_,0xff);
              fVar197 = fVar197 - auVar82._0_4_;
              auVar82 = vshufps_avx(auVar79,auVar79,0xff);
              auVar83 = vfmsub213ss_fma(auVar84,ZEXT416((uint)fVar137),auVar82);
              fVar137 = auVar80._0_4_ * fVar137;
              auVar84 = vfmsub231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar83._0_4_)),
                                        ZEXT416((uint)fVar233),ZEXT416((uint)fVar137));
              fVar227 = auVar84._0_4_;
              auVar221._0_4_ = fVar137 / fVar227;
              auVar221._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar200._0_4_ = auVar83._0_4_ / fVar227;
              auVar200._4_12_ = auVar83._4_12_;
              auVar83 = vmulss_avx512f(auVar1,auVar221);
              auVar84 = vmulss_avx512f(auVar1,auVar200);
              fVar224 = fVar224 - (auVar83._0_4_ - fVar197 * (auVar81._0_4_ / fVar227));
              fVar225 = fVar225 - (fVar197 * (fVar233 / fVar227) - auVar84._0_4_);
              auVar207._8_4_ = 0x7fffffff;
              auVar207._0_8_ = 0x7fffffff7fffffff;
              auVar207._12_4_ = 0x7fffffff;
              auVar81 = vandps_avx512vl(auVar1,auVar207);
              auVar81 = vucomiss_avx512f(auVar81);
              bVar75 = true;
              if (!(bool)uVar74 && !(bool)uVar76) {
                auVar81 = vaddss_avx512f(auVar2,auVar81);
                auVar83 = vfmadd231ss_fma(auVar81,local_5d0,ZEXT416(0x36000000));
                auVar81 = vandps_avx(ZEXT416((uint)fVar197),auVar207);
                if (auVar81._0_4_ < auVar83._0_4_) {
                  fVar225 = fVar225 + (float)local_5c0._0_4_;
                  if ((((fVar136 <= fVar225) &&
                       (fVar233 = *(float *)(ray + k * 4 + 0x80), fVar225 <= fVar233)) &&
                      (0.0 <= fVar224)) && (fVar224 <= 1.0)) {
                    auVar55._12_4_ = 0;
                    auVar55._0_12_ = ZEXT812(0);
                    auVar81 = vrsqrt14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)local_600._0_4_));
                    fVar137 = auVar81._0_4_;
                    pGVar4 = (context->scene->geometries).items[local_6b8].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar72 = true;
                      }
                      else {
                        fVar137 = fVar137 * 1.5 +
                                  (float)local_600._0_4_ * -0.5 * fVar137 * fVar137 * fVar137;
                        auVar160._0_4_ = local_660._0_4_ * fVar137;
                        auVar160._4_4_ = local_660._4_4_ * fVar137;
                        auVar160._8_4_ = local_660._8_4_ * fVar137;
                        auVar160._12_4_ = local_660._12_4_ * fVar137;
                        auVar83 = vfmadd213ps_fma(auVar82,auVar160,auVar79);
                        auVar81 = vshufps_avx(auVar160,auVar160,0xc9);
                        auVar82 = vshufps_avx(auVar79,auVar79,0xc9);
                        auVar161._0_4_ = auVar160._0_4_ * auVar82._0_4_;
                        auVar161._4_4_ = auVar160._4_4_ * auVar82._4_4_;
                        auVar161._8_4_ = auVar160._8_4_ * auVar82._8_4_;
                        auVar161._12_4_ = auVar160._12_4_ * auVar82._12_4_;
                        auVar79 = vfmsub231ps_fma(auVar161,auVar79,auVar81);
                        auVar81 = vshufps_avx(auVar79,auVar79,0xc9);
                        auVar82 = vshufps_avx(auVar83,auVar83,0xc9);
                        auVar79 = vshufps_avx(auVar79,auVar79,0xd2);
                        auVar140._0_4_ = auVar83._0_4_ * auVar79._0_4_;
                        auVar140._4_4_ = auVar83._4_4_ * auVar79._4_4_;
                        auVar140._8_4_ = auVar83._8_4_ * auVar79._8_4_;
                        auVar140._12_4_ = auVar83._12_4_ * auVar79._12_4_;
                        auVar81 = vfmsub231ps_fma(auVar140,auVar81,auVar82);
                        local_440 = (RTCHitN  [16])vshufps_avx(auVar81,auVar81,0x55);
                        auStack_430 = vshufps_avx(auVar81,auVar81,0xaa);
                        local_420 = auVar81._0_4_;
                        uStack_41c = local_420;
                        uStack_418 = local_420;
                        uStack_414 = local_420;
                        local_410 = fVar224;
                        fStack_40c = fVar224;
                        fStack_408 = fVar224;
                        fStack_404 = fVar224;
                        local_400 = ZEXT416(0) << 0x20;
                        local_3f0 = local_450._0_8_;
                        uStack_3e8 = local_450._8_8_;
                        local_3e0 = local_460;
                        vpcmpeqd_avx2(ZEXT1632(local_460),ZEXT1632(local_460));
                        uStack_3cc = context->user->instID[0];
                        local_3d0 = uStack_3cc;
                        uStack_3c8 = uStack_3cc;
                        uStack_3c4 = uStack_3cc;
                        uStack_3c0 = context->user->instPrimID[0];
                        uStack_3bc = uStack_3c0;
                        uStack_3b8 = uStack_3c0;
                        uStack_3b4 = uStack_3c0;
                        *(float *)(ray + k * 4 + 0x80) = fVar225;
                        local_8d0 = local_470._0_8_;
                        uStack_8c8 = local_470._8_8_;
                        local_6b0.valid = (int *)&local_8d0;
                        local_6b0.geometryUserPtr = pGVar4->userPtr;
                        local_6b0.context = context->user;
                        local_6b0.hit = local_440;
                        local_6b0.N = 4;
                        local_6b0.ray = (RTCRayN *)ray;
                        if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar4->occlusionFilterN)(&local_6b0);
                          auVar250 = ZEXT3264(local_700);
                          auVar232 = ZEXT3264(local_7c0);
                          auVar246 = ZEXT3264(local_7e0);
                          auVar207._8_4_ = 0x7fffffff;
                          auVar207._0_8_ = 0x7fffffff7fffffff;
                          auVar207._12_4_ = 0x7fffffff;
                          auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        }
                        auVar57._8_8_ = uStack_8c8;
                        auVar57._0_8_ = local_8d0;
                        uVar78 = vptestmd_avx512vl(auVar57,auVar57);
                        if ((uVar78 & 0xf) == 0) {
                          bVar72 = false;
                        }
                        else {
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var6)(&local_6b0);
                            auVar250 = ZEXT3264(local_700);
                            auVar232 = ZEXT3264(local_7c0);
                            auVar246 = ZEXT3264(local_7e0);
                            auVar207._8_4_ = 0x7fffffff;
                            auVar207._0_8_ = 0x7fffffff7fffffff;
                            auVar207._12_4_ = 0x7fffffff;
                            auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          }
                          auVar58._8_8_ = uStack_8c8;
                          auVar58._0_8_ = local_8d0;
                          uVar78 = vptestmd_avx512vl(auVar58,auVar58);
                          uVar78 = uVar78 & 0xf;
                          auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar75 = (bool)((byte)uVar78 & 1);
                          bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar8 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar9 = SUB81(uVar78 >> 3,0);
                          *(uint *)(local_6b0.ray + 0x80) =
                               (uint)bVar75 * auVar81._0_4_ |
                               (uint)!bVar75 * *(int *)(local_6b0.ray + 0x80);
                          *(uint *)(local_6b0.ray + 0x84) =
                               (uint)bVar7 * auVar81._4_4_ |
                               (uint)!bVar7 * *(int *)(local_6b0.ray + 0x84);
                          *(uint *)(local_6b0.ray + 0x88) =
                               (uint)bVar8 * auVar81._8_4_ |
                               (uint)!bVar8 * *(int *)(local_6b0.ray + 0x88);
                          *(uint *)(local_6b0.ray + 0x8c) =
                               (uint)bVar9 * auVar81._12_4_ |
                               (uint)!bVar9 * *(int *)(local_6b0.ray + 0x8c);
                          bVar72 = (byte)uVar78 != 0;
                        }
                        if ((bool)bVar72 == false) {
                          *(float *)(ray + k * 4 + 0x80) = fVar233;
                        }
                      }
                      bVar75 = false;
                      goto LAB_01d7791c;
                    }
                  }
                  bVar75 = false;
                  bVar72 = 0;
                }
              }
LAB_01d7791c:
              if (!bVar75) goto LAB_01d77d3b;
              lVar73 = lVar73 + -1;
            } while (lVar73 != 0);
            bVar72 = 0;
LAB_01d77d3b:
            bVar71 = bVar71 | bVar72 & 1;
            auVar61._4_4_ = fStack_31c;
            auVar61._0_4_ = local_320;
            auVar61._8_4_ = fStack_318;
            auVar61._12_4_ = fStack_314;
            auVar61._16_4_ = fStack_310;
            auVar61._20_4_ = fStack_30c;
            auVar61._24_4_ = fStack_308;
            auVar61._28_4_ = fStack_304;
            uVar198 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar31._4_4_ = uVar198;
            auVar31._0_4_ = uVar198;
            auVar31._8_4_ = uVar198;
            auVar31._12_4_ = uVar198;
            auVar31._16_4_ = uVar198;
            auVar31._20_4_ = uVar198;
            auVar31._24_4_ = uVar198;
            auVar31._28_4_ = uVar198;
            uVar16 = vcmpps_avx512vl(auVar61,auVar31,2);
            bVar66 = bVar64 & bVar66 & (byte)uVar16;
          } while (bVar66 != 0);
        }
        auVar151._0_4_ = (float)local_360._0_4_ + (float)local_340._0_4_;
        auVar151._4_4_ = (float)local_360._4_4_ + (float)local_340._4_4_;
        auVar151._8_4_ = fStack_358 + fStack_338;
        auVar151._12_4_ = fStack_354 + fStack_334;
        auVar151._16_4_ = fStack_350 + fStack_330;
        auVar151._20_4_ = fStack_34c + fStack_32c;
        auVar151._24_4_ = fStack_348 + fStack_328;
        auVar151._28_4_ = fStack_344 + fStack_324;
        uVar198 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar32._4_4_ = uVar198;
        auVar32._0_4_ = uVar198;
        auVar32._8_4_ = uVar198;
        auVar32._12_4_ = uVar198;
        auVar32._16_4_ = uVar198;
        auVar32._20_4_ = uVar198;
        auVar32._24_4_ = uVar198;
        auVar32._28_4_ = uVar198;
        uVar16 = vcmpps_avx512vl(auVar151,auVar32,2);
        bVar72 = (byte)local_8ac | (byte)local_8b4;
        bVar67 = (byte)uVar17 & bVar67 & (byte)uVar16;
        auVar152._8_4_ = 2;
        auVar152._0_8_ = 0x200000002;
        auVar152._12_4_ = 2;
        auVar152._16_4_ = 2;
        auVar152._20_4_ = 2;
        auVar152._24_4_ = 2;
        auVar152._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar91 = vpblendmd_avx512vl(auVar152,auVar33);
        local_340._0_4_ = (uint)(bVar72 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar72 & 1) * 2;
        bVar75 = (bool)(bVar72 >> 1 & 1);
        local_340._4_4_ = (uint)bVar75 * auVar91._4_4_ | (uint)!bVar75 * 2;
        bVar75 = (bool)(bVar72 >> 2 & 1);
        fStack_338 = (float)((uint)bVar75 * auVar91._8_4_ | (uint)!bVar75 * 2);
        bVar75 = (bool)(bVar72 >> 3 & 1);
        fStack_334 = (float)((uint)bVar75 * auVar91._12_4_ | (uint)!bVar75 * 2);
        bVar75 = (bool)(bVar72 >> 4 & 1);
        fStack_330 = (float)((uint)bVar75 * auVar91._16_4_ | (uint)!bVar75 * 2);
        bVar75 = (bool)(bVar72 >> 5 & 1);
        fStack_32c = (float)((uint)bVar75 * auVar91._20_4_ | (uint)!bVar75 * 2);
        bVar75 = (bool)(bVar72 >> 6 & 1);
        fStack_328 = (float)((uint)bVar75 * auVar91._24_4_ | (uint)!bVar75 * 2);
        fStack_324 = (float)((uint)(bVar72 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar72 >> 7) * 2);
        uVar16 = vpcmpd_avx512vl(_local_340,local_2c0,2);
        bVar72 = (byte)uVar16 & bVar67;
        if (bVar72 == 0) {
          auVar211 = ZEXT3264(local_680);
          auVar253 = ZEXT3264(auVar116);
          auVar241 = ZEXT3264(local_720);
          auVar249 = ZEXT3264(local_780);
          auVar252 = ZEXT3264(local_7a0);
          auVar251 = ZEXT3264(local_800);
          auVar243 = ZEXT3264(local_840);
          auVar242 = ZEXT3264(local_820);
          auVar247 = ZEXT3264(local_860);
          auVar248 = ZEXT3264(local_880);
          auVar254 = ZEXT3264(local_8a0);
          auVar244 = ZEXT3264(local_740);
          auVar245 = ZEXT3264(local_760);
          auVar230 = ZEXT3264(local_620);
        }
        else {
          auVar82 = vminps_avx(local_4e0._0_16_,local_520._0_16_);
          auVar81 = vmaxps_avx(local_4e0._0_16_,local_520._0_16_);
          auVar79 = vminps_avx(local_500._0_16_,local_540._0_16_);
          auVar83 = vminps_avx(auVar82,auVar79);
          auVar82 = vmaxps_avx(local_500._0_16_,local_540._0_16_);
          auVar79 = vmaxps_avx(auVar81,auVar82);
          auVar81 = vandps_avx(auVar83,auVar207);
          auVar82 = vandps_avx(auVar79,auVar207);
          auVar81 = vmaxps_avx(auVar81,auVar82);
          auVar82 = vmovshdup_avx(auVar81);
          auVar82 = vmaxss_avx(auVar82,auVar81);
          auVar81 = vshufpd_avx(auVar81,auVar81,1);
          auVar81 = vmaxss_avx(auVar81,auVar82);
          fVar217 = auVar81._0_4_ * 1.9073486e-06;
          local_5d0 = vshufps_avx(auVar79,auVar79,0xff);
          _local_4c0 = _local_280;
          local_320 = (float)local_360._0_4_ + (float)local_280._0_4_;
          fStack_31c = (float)local_360._4_4_ + (float)local_280._4_4_;
          fStack_318 = fStack_358 + fStack_278;
          fStack_314 = fStack_354 + fStack_274;
          fStack_310 = fStack_350 + fStack_270;
          fStack_30c = fStack_34c + fStack_26c;
          fStack_308 = fStack_348 + fStack_268;
          fStack_304 = fStack_344 + fStack_264;
          do {
            auVar153._8_4_ = 0x7f800000;
            auVar153._0_8_ = 0x7f8000007f800000;
            auVar153._12_4_ = 0x7f800000;
            auVar153._16_4_ = 0x7f800000;
            auVar153._20_4_ = 0x7f800000;
            auVar153._24_4_ = 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar91 = vblendmps_avx512vl(auVar153,_local_4c0);
            auVar127._0_4_ =
                 (uint)(bVar72 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar72 & 1) * 0x7f800000;
            bVar75 = (bool)(bVar72 >> 1 & 1);
            auVar127._4_4_ = (uint)bVar75 * auVar91._4_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar72 >> 2 & 1);
            auVar127._8_4_ = (uint)bVar75 * auVar91._8_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar72 >> 3 & 1);
            auVar127._12_4_ = (uint)bVar75 * auVar91._12_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar72 >> 4 & 1);
            auVar127._16_4_ = (uint)bVar75 * auVar91._16_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar72 >> 5 & 1);
            auVar127._20_4_ = (uint)bVar75 * auVar91._20_4_ | (uint)!bVar75 * 0x7f800000;
            auVar127._24_4_ =
                 (uint)(bVar72 >> 6) * auVar91._24_4_ | (uint)!(bool)(bVar72 >> 6) * 0x7f800000;
            auVar127._28_4_ = 0x7f800000;
            auVar91 = vshufps_avx(auVar127,auVar127,0xb1);
            auVar91 = vminps_avx(auVar127,auVar91);
            auVar90 = vshufpd_avx(auVar91,auVar91,5);
            auVar91 = vminps_avx(auVar91,auVar90);
            auVar90 = vpermpd_avx2(auVar91,0x4e);
            auVar91 = vminps_avx(auVar91,auVar90);
            uVar16 = vcmpps_avx512vl(auVar127,auVar91,0);
            bVar64 = (byte)uVar16 & bVar72;
            bVar66 = bVar72;
            if (bVar64 != 0) {
              bVar66 = bVar64;
            }
            iVar19 = 0;
            for (uVar69 = (uint)bVar66; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            bVar66 = '\x01' << ((byte)iVar19 & 0x1f);
            fVar224 = *(float *)(local_300 + (uint)(iVar19 << 2));
            fVar225 = *(float *)(local_260 + (uint)(iVar19 << 2));
            fVar226 = local_8a4;
            if ((float)local_640._0_4_ < 0.0) {
              fVar226 = sqrtf((float)local_640._0_4_);
            }
            bVar64 = ~bVar66;
            lVar73 = 5;
            do {
              auVar141._4_4_ = fVar225;
              auVar141._0_4_ = fVar225;
              auVar141._8_4_ = fVar225;
              auVar141._12_4_ = fVar225;
              auVar82 = vfmadd132ps_fma(auVar141,ZEXT816(0) << 0x40,local_630);
              fVar233 = 1.0 - fVar224;
              auVar185._0_4_ = local_520._0_4_ * fVar224;
              auVar185._4_4_ = local_520._4_4_ * fVar224;
              auVar185._8_4_ = local_520._8_4_ * fVar224;
              auVar185._12_4_ = local_520._12_4_ * fVar224;
              local_570 = ZEXT416((uint)fVar233);
              auVar201._4_4_ = fVar233;
              auVar201._0_4_ = fVar233;
              auVar201._8_4_ = fVar233;
              auVar201._12_4_ = fVar233;
              auVar81 = vfmadd231ps_fma(auVar185,auVar201,local_4e0._0_16_);
              auVar208._0_4_ = local_500._0_4_ * fVar224;
              auVar208._4_4_ = local_500._4_4_ * fVar224;
              auVar208._8_4_ = local_500._8_4_ * fVar224;
              auVar208._12_4_ = local_500._12_4_ * fVar224;
              auVar79 = vfmadd231ps_fma(auVar208,auVar201,local_520._0_16_);
              auVar215._0_4_ = fVar224 * (float)local_540._0_4_;
              auVar215._4_4_ = fVar224 * (float)local_540._4_4_;
              auVar215._8_4_ = fVar224 * fStack_538;
              auVar215._12_4_ = fVar224 * fStack_534;
              auVar83 = vfmadd231ps_fma(auVar215,auVar201,local_500._0_16_);
              auVar222._0_4_ = fVar224 * auVar79._0_4_;
              auVar222._4_4_ = fVar224 * auVar79._4_4_;
              auVar222._8_4_ = fVar224 * auVar79._8_4_;
              auVar222._12_4_ = fVar224 * auVar79._12_4_;
              auVar81 = vfmadd231ps_fma(auVar222,auVar201,auVar81);
              auVar186._0_4_ = fVar224 * auVar83._0_4_;
              auVar186._4_4_ = fVar224 * auVar83._4_4_;
              auVar186._8_4_ = fVar224 * auVar83._8_4_;
              auVar186._12_4_ = fVar224 * auVar83._12_4_;
              auVar79 = vfmadd231ps_fma(auVar186,auVar201,auVar79);
              auVar209._0_4_ = fVar224 * auVar79._0_4_;
              auVar209._4_4_ = fVar224 * auVar79._4_4_;
              auVar209._8_4_ = fVar224 * auVar79._8_4_;
              auVar209._12_4_ = fVar224 * auVar79._12_4_;
              auVar83 = vfmadd231ps_fma(auVar209,auVar81,auVar201);
              auVar81 = vsubps_avx(auVar79,auVar81);
              auVar23._8_4_ = 0x40400000;
              auVar23._0_8_ = 0x4040000040400000;
              auVar23._12_4_ = 0x40400000;
              auVar79 = vmulps_avx512vl(auVar81,auVar23);
              local_4a0._0_16_ = auVar83;
              auVar81 = vsubps_avx(auVar82,auVar83);
              local_660._0_16_ = auVar81;
              auVar81 = vdpps_avx(auVar81,auVar81,0x7f);
              local_600._0_16_ = auVar81;
              local_920 = ZEXT416((uint)fVar224);
              if (auVar81._0_4_ < 0.0) {
                auVar211._0_4_ = sqrtf(auVar81._0_4_);
                auVar211._4_60_ = extraout_var_01;
                auVar81 = auVar211._0_16_;
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
              }
              local_580 = vdpps_avx(auVar79,auVar79,0x7f);
              fVar233 = local_580._0_4_;
              auVar187._4_12_ = ZEXT812(0) << 0x20;
              auVar187._0_4_ = fVar233;
              auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
              fVar137 = auVar82._0_4_;
              local_590 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar83 = vxorps_avx512vl(local_580,auVar24);
              auVar82 = vfnmadd213ss_fma(local_590,local_580,ZEXT416(0x40000000));
              uVar69 = auVar81._0_4_;
              if (fVar233 < auVar83._0_4_) {
                auVar230._0_4_ = sqrtf(fVar233);
                auVar230._4_60_ = extraout_var_02;
                auVar81 = ZEXT416(uVar69);
                auVar83 = auVar230._0_16_;
              }
              else {
                auVar83 = vsqrtss_avx512f(local_580,local_580);
              }
              fVar233 = fVar137 * 1.5 + fVar233 * -0.5 * fVar137 * fVar137 * fVar137;
              local_5a0._0_4_ = auVar79._0_4_ * fVar233;
              local_5a0._4_4_ = auVar79._4_4_ * fVar233;
              local_5a0._8_4_ = auVar79._8_4_ * fVar233;
              local_5a0._12_4_ = auVar79._12_4_ * fVar233;
              auVar1 = vdpps_avx(local_660._0_16_,local_5a0,0x7f);
              auVar84 = vaddss_avx512f(auVar81,ZEXT416(0x3f800000));
              auVar142._0_4_ = auVar1._0_4_ * auVar1._0_4_;
              auVar142._4_4_ = auVar1._4_4_ * auVar1._4_4_;
              auVar142._8_4_ = auVar1._8_4_ * auVar1._8_4_;
              auVar142._12_4_ = auVar1._12_4_ * auVar1._12_4_;
              auVar2 = vsubps_avx(local_600._0_16_,auVar142);
              fVar137 = auVar2._0_4_;
              auVar162._4_12_ = ZEXT812(0) << 0x20;
              auVar162._0_4_ = fVar137;
              auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar162);
              fVar227 = auVar80._0_4_;
              uVar76 = fVar137 == 0.0;
              uVar74 = fVar137 < 0.0;
              if ((bool)uVar74) {
                local_5b0 = fVar233;
                fStack_5ac = fVar233;
                fStack_5a8 = fVar233;
                fStack_5a4 = fVar233;
                fVar197 = sqrtf(fVar137);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar81 = ZEXT416(uVar69);
                auVar84 = ZEXT416(auVar84._0_4_);
                fVar233 = local_5b0;
                fVar228 = fStack_5ac;
                fVar237 = fStack_5a8;
                fVar238 = fStack_5a4;
              }
              else {
                auVar2 = vsqrtss_avx(auVar2,auVar2);
                fVar197 = auVar2._0_4_;
                fVar228 = fVar233;
                fVar237 = fVar233;
                fVar238 = fVar233;
              }
              auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar253 = ZEXT3264(auVar91);
              auVar246 = ZEXT3264(local_7e0);
              auVar230 = ZEXT3264(local_620);
              auVar232 = ZEXT3264(local_7c0);
              auVar251 = ZEXT3264(local_800);
              auVar250 = ZEXT3264(local_700);
              auVar241 = ZEXT3264(local_720);
              auVar242 = ZEXT3264(local_820);
              auVar243 = ZEXT3264(local_840);
              auVar244 = ZEXT3264(local_740);
              auVar245 = ZEXT3264(local_760);
              auVar247 = ZEXT3264(local_860);
              auVar248 = ZEXT3264(local_880);
              auVar249 = ZEXT3264(local_780);
              auVar254 = ZEXT3264(local_8a0);
              auVar252 = ZEXT3264(local_7a0);
              auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920,local_570);
              fVar155 = auVar2._0_4_ * 6.0;
              fVar15 = fVar224 * 6.0;
              auVar188._0_4_ = fVar15 * (float)local_540._0_4_;
              auVar188._4_4_ = fVar15 * (float)local_540._4_4_;
              auVar188._8_4_ = fVar15 * fStack_538;
              auVar188._12_4_ = fVar15 * fStack_534;
              auVar163._4_4_ = fVar155;
              auVar163._0_4_ = fVar155;
              auVar163._8_4_ = fVar155;
              auVar163._12_4_ = fVar155;
              auVar2 = vfmadd132ps_fma(auVar163,auVar188,local_500._0_16_);
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_570,local_920);
              fVar155 = auVar80._0_4_ * 6.0;
              auVar189._4_4_ = fVar155;
              auVar189._0_4_ = fVar155;
              auVar189._8_4_ = fVar155;
              auVar189._12_4_ = fVar155;
              auVar2 = vfmadd132ps_fma(auVar189,auVar2,local_520._0_16_);
              fVar155 = local_570._0_4_ * 6.0;
              auVar164._4_4_ = fVar155;
              auVar164._0_4_ = fVar155;
              auVar164._8_4_ = fVar155;
              auVar164._12_4_ = fVar155;
              auVar2 = vfmadd132ps_fma(auVar164,auVar2,local_4e0._0_16_);
              auVar190._0_4_ = auVar2._0_4_ * (float)local_580._0_4_;
              auVar190._4_4_ = auVar2._4_4_ * (float)local_580._0_4_;
              auVar190._8_4_ = auVar2._8_4_ * (float)local_580._0_4_;
              auVar190._12_4_ = auVar2._12_4_ * (float)local_580._0_4_;
              auVar2 = vdpps_avx(auVar79,auVar2,0x7f);
              fVar155 = auVar2._0_4_;
              auVar165._0_4_ = auVar79._0_4_ * fVar155;
              auVar165._4_4_ = auVar79._4_4_ * fVar155;
              auVar165._8_4_ = auVar79._8_4_ * fVar155;
              auVar165._12_4_ = auVar79._12_4_ * fVar155;
              auVar80 = vsubps_avx(auVar190,auVar165);
              fVar155 = auVar82._0_4_ * (float)local_590._0_4_;
              auVar2 = vmaxss_avx(ZEXT416((uint)fVar217),
                                  ZEXT416((uint)(fVar225 * fVar226 * 1.9073486e-06)));
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar85 = vxorps_avx512vl(auVar79,auVar25);
              auVar191._0_4_ = fVar233 * auVar80._0_4_ * fVar155;
              auVar191._4_4_ = fVar228 * auVar80._4_4_ * fVar155;
              auVar191._8_4_ = fVar237 * auVar80._8_4_ * fVar155;
              auVar191._12_4_ = fVar238 * auVar80._12_4_ * fVar155;
              auVar82 = vdpps_avx(auVar85,local_5a0,0x7f);
              auVar80 = vdivss_avx512f(ZEXT416((uint)fVar217),auVar83);
              auVar83 = vfmadd213ss_fma(auVar81,ZEXT416((uint)fVar217),auVar2);
              auVar81 = vdpps_avx(local_660._0_16_,auVar191,0x7f);
              vfmadd213ss_avx512f(auVar84,auVar80,auVar83);
              fVar233 = auVar82._0_4_ + auVar81._0_4_;
              auVar81 = vdpps_avx(local_630,local_5a0,0x7f);
              auVar82 = vdpps_avx(local_660._0_16_,auVar85,0x7f);
              fVar137 = fVar227 * fVar137 * -0.5 * fVar227 * fVar227 + fVar227 * 1.5;
              auVar83 = vdpps_avx(local_660._0_16_,local_630,0x7f);
              in_ZMM31 = ZEXT1664(auVar1);
              auVar84 = vfnmadd231ss_avx512f(auVar82,auVar1,ZEXT416((uint)fVar233));
              auVar80 = vfnmadd231ss_avx512f(auVar83,auVar1,auVar81);
              auVar82 = vpermilps_avx(local_4a0._0_16_,0xff);
              fVar197 = fVar197 - auVar82._0_4_;
              auVar82 = vshufps_avx(auVar79,auVar79,0xff);
              auVar83 = vfmsub213ss_fma(auVar84,ZEXT416((uint)fVar137),auVar82);
              fVar137 = auVar80._0_4_ * fVar137;
              auVar84 = vfmsub231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar83._0_4_)),
                                        ZEXT416((uint)fVar233),ZEXT416((uint)fVar137));
              fVar227 = auVar84._0_4_;
              auVar223._0_4_ = fVar137 / fVar227;
              auVar223._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar202._0_4_ = auVar83._0_4_ / fVar227;
              auVar202._4_12_ = auVar83._4_12_;
              auVar83 = vmulss_avx512f(auVar1,auVar223);
              auVar84 = vmulss_avx512f(auVar1,auVar202);
              fVar224 = fVar224 - (auVar83._0_4_ - fVar197 * (auVar81._0_4_ / fVar227));
              fVar225 = fVar225 - (fVar197 * (fVar233 / fVar227) - auVar84._0_4_);
              auVar210._8_4_ = 0x7fffffff;
              auVar210._0_8_ = 0x7fffffff7fffffff;
              auVar210._12_4_ = 0x7fffffff;
              auVar81 = vandps_avx512vl(auVar1,auVar210);
              auVar81 = vucomiss_avx512f(auVar81);
              bVar75 = true;
              if ((bool)uVar74 || (bool)uVar76) {
LAB_01d78524:
                auVar211 = ZEXT3264(local_680);
              }
              else {
                auVar81 = vaddss_avx512f(auVar2,auVar81);
                auVar83 = vfmadd231ss_fma(auVar81,local_5d0,ZEXT416(0x36000000));
                auVar81 = vandps_avx(ZEXT416((uint)fVar197),auVar210);
                if (auVar83._0_4_ <= auVar81._0_4_) goto LAB_01d78524;
                fVar225 = fVar225 + (float)local_5c0._0_4_;
                auVar211 = ZEXT3264(local_680);
                if ((((fVar225 < fVar136) ||
                     (fVar233 = *(float *)(ray + k * 4 + 0x80), fVar233 < fVar225)) ||
                    (fVar224 < 0.0)) || (1.0 < fVar224)) {
LAB_01d7851f:
                  bVar75 = false;
                  bVar66 = 0;
                }
                else {
                  auVar56._12_4_ = 0;
                  auVar56._0_12_ = ZEXT812(0);
                  auVar81 = vrsqrt14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)local_600._0_4_));
                  fVar137 = auVar81._0_4_;
                  pGVar4 = (context->scene->geometries).items[local_6b8].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_01d7851f;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar66 = true;
                  }
                  else {
                    fVar137 = fVar137 * 1.5 +
                              (float)local_600._0_4_ * -0.5 * fVar137 * fVar137 * fVar137;
                    auVar166._0_4_ = local_660._0_4_ * fVar137;
                    auVar166._4_4_ = local_660._4_4_ * fVar137;
                    auVar166._8_4_ = local_660._8_4_ * fVar137;
                    auVar166._12_4_ = local_660._12_4_ * fVar137;
                    auVar83 = vfmadd213ps_fma(auVar82,auVar166,auVar79);
                    auVar81 = vshufps_avx(auVar166,auVar166,0xc9);
                    auVar82 = vshufps_avx(auVar79,auVar79,0xc9);
                    auVar167._0_4_ = auVar166._0_4_ * auVar82._0_4_;
                    auVar167._4_4_ = auVar166._4_4_ * auVar82._4_4_;
                    auVar167._8_4_ = auVar166._8_4_ * auVar82._8_4_;
                    auVar167._12_4_ = auVar166._12_4_ * auVar82._12_4_;
                    auVar79 = vfmsub231ps_fma(auVar167,auVar79,auVar81);
                    auVar81 = vshufps_avx(auVar79,auVar79,0xc9);
                    auVar82 = vshufps_avx(auVar83,auVar83,0xc9);
                    auVar79 = vshufps_avx(auVar79,auVar79,0xd2);
                    auVar143._0_4_ = auVar83._0_4_ * auVar79._0_4_;
                    auVar143._4_4_ = auVar83._4_4_ * auVar79._4_4_;
                    auVar143._8_4_ = auVar83._8_4_ * auVar79._8_4_;
                    auVar143._12_4_ = auVar83._12_4_ * auVar79._12_4_;
                    auVar81 = vfmsub231ps_fma(auVar143,auVar81,auVar82);
                    local_440 = (RTCHitN  [16])vshufps_avx(auVar81,auVar81,0x55);
                    auStack_430 = vshufps_avx(auVar81,auVar81,0xaa);
                    local_420 = auVar81._0_4_;
                    uStack_41c = local_420;
                    uStack_418 = local_420;
                    uStack_414 = local_420;
                    local_410 = fVar224;
                    fStack_40c = fVar224;
                    fStack_408 = fVar224;
                    fStack_404 = fVar224;
                    local_400 = ZEXT416(0) << 0x20;
                    local_3f0 = local_450._0_8_;
                    uStack_3e8 = local_450._8_8_;
                    local_3e0 = local_460;
                    vpcmpeqd_avx2(ZEXT1632(local_460),ZEXT1632(local_460));
                    uStack_3cc = context->user->instID[0];
                    local_3d0 = uStack_3cc;
                    uStack_3c8 = uStack_3cc;
                    uStack_3c4 = uStack_3cc;
                    uStack_3c0 = context->user->instPrimID[0];
                    uStack_3bc = uStack_3c0;
                    uStack_3b8 = uStack_3c0;
                    uStack_3b4 = uStack_3c0;
                    *(float *)(ray + k * 4 + 0x80) = fVar225;
                    local_8d0 = local_470._0_8_;
                    uStack_8c8 = local_470._8_8_;
                    local_6b0.valid = (int *)&local_8d0;
                    local_6b0.geometryUserPtr = pGVar4->userPtr;
                    local_6b0.context = context->user;
                    local_6b0.hit = local_440;
                    local_6b0.N = 4;
                    local_6b0.ray = (RTCRayN *)ray;
                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->occlusionFilterN)(&local_6b0);
                      auVar252 = ZEXT3264(local_7a0);
                      auVar254 = ZEXT3264(local_8a0);
                      auVar249 = ZEXT3264(local_780);
                      auVar248 = ZEXT3264(local_880);
                      auVar247 = ZEXT3264(local_860);
                      auVar245 = ZEXT3264(local_760);
                      auVar244 = ZEXT3264(local_740);
                      auVar243 = ZEXT3264(local_840);
                      auVar242 = ZEXT3264(local_820);
                      auVar241 = ZEXT3264(local_720);
                      auVar211 = ZEXT3264(local_680);
                      auVar250 = ZEXT3264(local_700);
                      auVar251 = ZEXT3264(local_800);
                      auVar232 = ZEXT3264(local_7c0);
                      auVar230 = ZEXT3264(local_620);
                      auVar246 = ZEXT3264(local_7e0);
                      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar253 = ZEXT3264(auVar91);
                    }
                    auVar59._8_8_ = uStack_8c8;
                    auVar59._0_8_ = local_8d0;
                    uVar78 = vptestmd_avx512vl(auVar59,auVar59);
                    if ((uVar78 & 0xf) == 0) {
                      bVar66 = false;
                    }
                    else {
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var6)(&local_6b0);
                        auVar252 = ZEXT3264(local_7a0);
                        auVar254 = ZEXT3264(local_8a0);
                        auVar249 = ZEXT3264(local_780);
                        auVar248 = ZEXT3264(local_880);
                        auVar247 = ZEXT3264(local_860);
                        auVar245 = ZEXT3264(local_760);
                        auVar244 = ZEXT3264(local_740);
                        auVar243 = ZEXT3264(local_840);
                        auVar242 = ZEXT3264(local_820);
                        auVar241 = ZEXT3264(local_720);
                        auVar211 = ZEXT3264(local_680);
                        auVar250 = ZEXT3264(local_700);
                        auVar251 = ZEXT3264(local_800);
                        auVar232 = ZEXT3264(local_7c0);
                        auVar230 = ZEXT3264(local_620);
                        auVar246 = ZEXT3264(local_7e0);
                        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar253 = ZEXT3264(auVar91);
                      }
                      auVar60._8_8_ = uStack_8c8;
                      auVar60._0_8_ = local_8d0;
                      uVar78 = vptestmd_avx512vl(auVar60,auVar60);
                      uVar78 = uVar78 & 0xf;
                      auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar75 = (bool)((byte)uVar78 & 1);
                      bVar7 = (bool)((byte)(uVar78 >> 1) & 1);
                      bVar8 = (bool)((byte)(uVar78 >> 2) & 1);
                      bVar9 = SUB81(uVar78 >> 3,0);
                      *(uint *)(local_6b0.ray + 0x80) =
                           (uint)bVar75 * auVar81._0_4_ |
                           (uint)!bVar75 * *(int *)(local_6b0.ray + 0x80);
                      *(uint *)(local_6b0.ray + 0x84) =
                           (uint)bVar7 * auVar81._4_4_ |
                           (uint)!bVar7 * *(int *)(local_6b0.ray + 0x84);
                      *(uint *)(local_6b0.ray + 0x88) =
                           (uint)bVar8 * auVar81._8_4_ |
                           (uint)!bVar8 * *(int *)(local_6b0.ray + 0x88);
                      *(uint *)(local_6b0.ray + 0x8c) =
                           (uint)bVar9 * auVar81._12_4_ |
                           (uint)!bVar9 * *(int *)(local_6b0.ray + 0x8c);
                      bVar66 = (byte)uVar78 != 0;
                    }
                    if ((bool)bVar66 == false) {
                      *(float *)(ray + k * 4 + 0x80) = fVar233;
                    }
                  }
                  bVar75 = false;
                }
              }
              if (!bVar75) goto LAB_01d7895a;
              lVar73 = lVar73 + -1;
            } while (lVar73 != 0);
            bVar66 = 0;
LAB_01d7895a:
            bVar71 = bVar71 | bVar66 & 1;
            auVar62._4_4_ = fStack_31c;
            auVar62._0_4_ = local_320;
            auVar62._8_4_ = fStack_318;
            auVar62._12_4_ = fStack_314;
            auVar62._16_4_ = fStack_310;
            auVar62._20_4_ = fStack_30c;
            auVar62._24_4_ = fStack_308;
            auVar62._28_4_ = fStack_304;
            uVar198 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar34._4_4_ = uVar198;
            auVar34._0_4_ = uVar198;
            auVar34._8_4_ = uVar198;
            auVar34._12_4_ = uVar198;
            auVar34._16_4_ = uVar198;
            auVar34._20_4_ = uVar198;
            auVar34._24_4_ = uVar198;
            auVar34._28_4_ = uVar198;
            uVar16 = vcmpps_avx512vl(auVar62,auVar34,2);
            bVar72 = bVar64 & bVar72 & (byte)uVar16;
          } while (bVar72 != 0);
        }
        uVar17 = vpcmpd_avx512vl(local_2c0,_local_340,1);
        uVar18 = vpcmpd_avx512vl(local_2c0,local_240,1);
        auVar172._0_4_ = (float)local_360._0_4_ + (float)local_1c0._0_4_;
        auVar172._4_4_ = (float)local_360._4_4_ + (float)local_1c0._4_4_;
        auVar172._8_4_ = fStack_358 + fStack_1b8;
        auVar172._12_4_ = fStack_354 + fStack_1b4;
        auVar172._16_4_ = fStack_350 + fStack_1b0;
        auVar172._20_4_ = fStack_34c + fStack_1ac;
        auVar172._24_4_ = fStack_348 + fStack_1a8;
        auVar172._28_4_ = fStack_344 + fStack_1a4;
        uVar198 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar195._4_4_ = uVar198;
        auVar195._0_4_ = uVar198;
        auVar195._8_4_ = uVar198;
        auVar195._12_4_ = uVar198;
        auVar195._16_4_ = uVar198;
        auVar195._20_4_ = uVar198;
        auVar195._24_4_ = uVar198;
        auVar195._28_4_ = uVar198;
        uVar16 = vcmpps_avx512vl(auVar172,auVar195,2);
        bVar72 = (byte)local_8b0 & (byte)uVar18 & (byte)uVar16;
        auVar203._0_4_ = (float)local_360._0_4_ + (float)local_280._0_4_;
        auVar203._4_4_ = (float)local_360._4_4_ + (float)local_280._4_4_;
        auVar203._8_4_ = fStack_358 + fStack_278;
        auVar203._12_4_ = fStack_354 + fStack_274;
        auVar203._16_4_ = fStack_350 + fStack_270;
        auVar203._20_4_ = fStack_34c + fStack_26c;
        auVar203._24_4_ = fStack_348 + fStack_268;
        auVar203._28_4_ = fStack_344 + fStack_264;
        uVar16 = vcmpps_avx512vl(auVar203,auVar195,2);
        bVar67 = bVar67 & (byte)uVar17 & (byte)uVar16 | bVar72;
        prim = local_6c8;
        if (bVar67 == 0) {
          auVar204 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar196 = ZEXT3264(local_560);
        }
        else {
          local_180[uVar65 * 0x60] = bVar67;
          bVar75 = (bool)(bVar72 >> 1 & 1);
          bVar7 = (bool)(bVar72 >> 2 & 1);
          bVar8 = (bool)(bVar72 >> 3 & 1);
          bVar9 = (bool)(bVar72 >> 4 & 1);
          bVar10 = (bool)(bVar72 >> 5 & 1);
          bVar11 = (bool)(bVar72 >> 6 & 1);
          auStack_160[uVar65 * 0x18] =
               (uint)(bVar72 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar72 & 1) * local_280._0_4_;
          auStack_160[uVar65 * 0x18 + 1] =
               (uint)bVar75 * local_1c0._4_4_ | (uint)!bVar75 * local_280._4_4_;
          auStack_160[uVar65 * 0x18 + 2] =
               (uint)bVar7 * (int)fStack_1b8 | (uint)!bVar7 * (int)fStack_278;
          auStack_160[uVar65 * 0x18 + 3] =
               (uint)bVar8 * (int)fStack_1b4 | (uint)!bVar8 * (int)fStack_274;
          auStack_160[uVar65 * 0x18 + 4] =
               (uint)bVar9 * (int)fStack_1b0 | (uint)!bVar9 * (int)fStack_270;
          local_140[uVar65 * 0x18 + -3] =
               (float)((uint)bVar10 * (int)fStack_1ac | (uint)!bVar10 * (int)fStack_26c);
          local_140[uVar65 * 0x18 + -2] =
               (float)((uint)bVar11 * (int)fStack_1a8 | (uint)!bVar11 * (int)fStack_268);
          local_140[uVar65 * 0x18 + -1] =
               (float)((uint)(bVar72 >> 7) * (int)fStack_1a4 |
                      (uint)!(bool)(bVar72 >> 7) * (int)fStack_264);
          uVar16 = vmovlps_avx(local_5e0);
          *(undefined8 *)(local_140 + uVar65 * 0x18) = uVar16;
          local_138[uVar65 * 0x18] = iVar70 + 1;
          uVar65 = (ulong)((int)uVar65 + 1);
          auVar204 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          auVar196 = ZEXT3264(local_560);
        }
      }
    }
    do {
      if ((int)uVar65 == 0) {
        if (bVar71 != 0) {
          return bVar77;
        }
        uVar198 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar36._4_4_ = uVar198;
        auVar36._0_4_ = uVar198;
        auVar36._8_4_ = uVar198;
        auVar36._12_4_ = uVar198;
        auVar36._16_4_ = uVar198;
        auVar36._20_4_ = uVar198;
        auVar36._24_4_ = uVar198;
        auVar36._28_4_ = uVar198;
        uVar16 = vcmpps_avx512vl(local_220,auVar36,2);
        uVar69 = (uint)uVar16 & (uint)local_6c0 - 1 & (uint)local_6c0;
        local_6c0 = (ulong)uVar69;
        bVar77 = uVar69 != 0;
        if (!bVar77) {
          return bVar77;
        }
        goto LAB_01d763a1;
      }
      uVar78 = (ulong)((int)uVar65 - 1);
      auVar91 = *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x18);
      auVar173._0_4_ = auVar91._0_4_ + (float)local_360._0_4_;
      auVar173._4_4_ = auVar91._4_4_ + (float)local_360._4_4_;
      auVar173._8_4_ = auVar91._8_4_ + fStack_358;
      auVar173._12_4_ = auVar91._12_4_ + fStack_354;
      auVar173._16_4_ = auVar91._16_4_ + fStack_350;
      auVar173._20_4_ = auVar91._20_4_ + fStack_34c;
      auVar173._24_4_ = auVar91._24_4_ + fStack_348;
      auVar173._28_4_ = auVar91._28_4_ + fStack_344;
      uVar198 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar35._4_4_ = uVar198;
      auVar35._0_4_ = uVar198;
      auVar35._8_4_ = uVar198;
      auVar35._12_4_ = uVar198;
      auVar35._16_4_ = uVar198;
      auVar35._20_4_ = uVar198;
      auVar35._24_4_ = uVar198;
      auVar35._28_4_ = uVar198;
      uVar16 = vcmpps_avx512vl(auVar173,auVar35,2);
      uVar69 = (uint)uVar16 & (uint)local_180[uVar78 * 0x60];
      bVar67 = (byte)uVar69;
      if (uVar69 != 0) {
        auVar174._8_4_ = 0x7f800000;
        auVar174._0_8_ = 0x7f8000007f800000;
        auVar174._12_4_ = 0x7f800000;
        auVar174._16_4_ = 0x7f800000;
        auVar174._20_4_ = 0x7f800000;
        auVar174._24_4_ = 0x7f800000;
        auVar174._28_4_ = 0x7f800000;
        auVar90 = vblendmps_avx512vl(auVar174,auVar91);
        auVar128._0_4_ =
             (uint)(bVar67 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar67 & 1) * (int)auVar91._0_4_;
        bVar75 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar128._4_4_ = (uint)bVar75 * auVar90._4_4_ | (uint)!bVar75 * (int)auVar91._4_4_;
        bVar75 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar128._8_4_ = (uint)bVar75 * auVar90._8_4_ | (uint)!bVar75 * (int)auVar91._8_4_;
        bVar75 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar128._12_4_ = (uint)bVar75 * auVar90._12_4_ | (uint)!bVar75 * (int)auVar91._12_4_;
        bVar75 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar128._16_4_ = (uint)bVar75 * auVar90._16_4_ | (uint)!bVar75 * (int)auVar91._16_4_;
        bVar75 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar128._20_4_ = (uint)bVar75 * auVar90._20_4_ | (uint)!bVar75 * (int)auVar91._20_4_;
        bVar75 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar128._24_4_ = (uint)bVar75 * auVar90._24_4_ | (uint)!bVar75 * (int)auVar91._24_4_;
        auVar128._28_4_ =
             (uVar69 >> 7) * auVar90._28_4_ | (uint)!SUB41(uVar69 >> 7,0) * (int)auVar91._28_4_;
        auVar91 = vshufps_avx(auVar128,auVar128,0xb1);
        auVar91 = vminps_avx(auVar128,auVar91);
        auVar90 = vshufpd_avx(auVar91,auVar91,5);
        auVar91 = vminps_avx(auVar91,auVar90);
        auVar90 = vpermpd_avx2(auVar91,0x4e);
        auVar91 = vminps_avx(auVar91,auVar90);
        uVar16 = vcmpps_avx512vl(auVar128,auVar91,0);
        bVar72 = (byte)uVar16 & bVar67;
        if (bVar72 != 0) {
          uVar69 = (uint)bVar72;
        }
        fVar217 = local_140[uVar78 * 0x18 + 1];
        uVar129 = 0;
        for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
          uVar129 = uVar129 + 1;
        }
        iVar70 = local_138[uVar78 * 0x18];
        bVar72 = ~('\x01' << ((byte)uVar129 & 0x1f)) & bVar67;
        local_180[uVar78 * 0x60] = bVar72;
        auVar196 = ZEXT3264(local_560);
        uVar68 = uVar78;
        if (bVar72 != 0) {
          uVar68 = uVar65;
        }
        fVar224 = local_140[uVar78 * 0x18];
        auVar175._4_4_ = fVar224;
        auVar175._0_4_ = fVar224;
        auVar175._8_4_ = fVar224;
        auVar175._12_4_ = fVar224;
        auVar175._16_4_ = fVar224;
        auVar175._20_4_ = fVar224;
        auVar175._24_4_ = fVar224;
        auVar175._28_4_ = fVar224;
        fVar217 = fVar217 - fVar224;
        auVar154._4_4_ = fVar217;
        auVar154._0_4_ = fVar217;
        auVar154._8_4_ = fVar217;
        auVar154._12_4_ = fVar217;
        auVar154._16_4_ = fVar217;
        auVar154._20_4_ = fVar217;
        auVar154._24_4_ = fVar217;
        auVar154._28_4_ = fVar217;
        auVar81 = vfmadd132ps_fma(auVar154,auVar175,_DAT_02020f20);
        _local_440 = ZEXT1632(auVar81);
        local_5e0._8_8_ = 0;
        local_5e0._0_8_ = *(ulong *)(local_440 + (ulong)uVar129 * 4);
        uVar78 = uVar68;
      }
      uVar65 = uVar78;
    } while (bVar67 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }